

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiIntersector1<4>::
     occluded_n<embree::sse2::OrientedCurve1Intersector1<embree::BSplineCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  float *pfVar2;
  Primitive PVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined6 uVar20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  bool bVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  RTCIntersectArguments *pRVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  uint uVar44;
  int iVar45;
  uint uVar46;
  int iVar47;
  uint uVar48;
  uint uVar49;
  short sVar50;
  float fVar51;
  float fVar87;
  float fVar88;
  vfloat_impl<4> p00;
  undefined2 uVar86;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  float fVar89;
  float fVar107;
  float fVar108;
  vfloat4 v;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float t1;
  float fVar109;
  float fVar110;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar122;
  float fVar127;
  float fVar128;
  vfloat4 v_1;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar129;
  float fVar142;
  float fVar143;
  vfloat4 a;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar144;
  float fVar158;
  float fVar159;
  undefined1 auVar145 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar160;
  undefined8 uVar161;
  float fVar169;
  undefined1 auVar162 [16];
  float fVar168;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar170;
  float fVar195;
  float fVar196;
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar197;
  float fVar210;
  float fVar211;
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar212;
  float fVar222;
  float fVar223;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar224;
  float fVar231;
  undefined8 uVar225;
  float fVar232;
  vfloat4 a_1;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar233;
  float fVar239;
  float fVar240;
  float fVar242;
  undefined1 auVar234 [16];
  float fVar241;
  float fVar243;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar244;
  float fVar245;
  float fVar252;
  undefined8 uVar246;
  float fVar251;
  float fVar253;
  float fVar255;
  undefined1 auVar247 [16];
  float fVar254;
  float fVar256;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar257;
  float fVar261;
  undefined8 uVar258;
  float fVar262;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  int local_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  ulong local_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 local_388;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined8 local_2a8;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  ulong local_280;
  RTCFilterFunctionNArguments local_278;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  uint auStack_1f8 [4];
  undefined8 local_1e8;
  float local_1e0;
  float local_1dc;
  float fStack_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  uint local_1cc;
  uint local_1c8;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  undefined1 auVar83 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 uVar85;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  
  PVar3 = prim[1];
  uVar41 = (ulong)(byte)PVar3;
  pPVar1 = prim + uVar41 * 0x19 + 6;
  fVar108 = *(float *)(pPVar1 + 0xc);
  fVar122 = ((ray->org).field_0.m128[0] - *(float *)pPVar1) * fVar108;
  fVar127 = ((ray->org).field_0.m128[1] - *(float *)(pPVar1 + 4)) * fVar108;
  fVar128 = ((ray->org).field_0.m128[2] - *(float *)(pPVar1 + 8)) * fVar108;
  fVar89 = fVar108 * (ray->dir).field_0.m128[0];
  fVar107 = fVar108 * (ray->dir).field_0.m128[1];
  fVar108 = fVar108 * (ray->dir).field_0.m128[2];
  uVar4 = *(undefined4 *)(prim + uVar41 * 4 + 6);
  uVar85 = (undefined1)((uint)uVar4 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar4 >> 0x10);
  uVar161 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar4));
  uVar85 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar161 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar95._8_4_ = 0;
  auVar95._0_8_ = uVar43;
  auVar95._12_2_ = uVar86;
  auVar95._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar161 >> 0x20);
  auVar214._12_4_ = auVar95._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar43;
  auVar214._10_2_ = uVar86;
  auVar59._10_6_ = auVar214._10_6_;
  auVar59._8_2_ = uVar86;
  auVar59._0_8_ = uVar43;
  uVar86 = (undefined2)uVar20;
  auVar21._4_8_ = auVar59._8_8_;
  auVar21._2_2_ = uVar86;
  auVar21._0_2_ = uVar86;
  fVar109 = (float)((int)sVar50 >> 8);
  fVar119 = (float)(auVar21._0_4_ >> 0x18);
  fVar120 = (float)(auVar59._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar41 * 5 + 6);
  uVar85 = (undefined1)((uint)uVar4 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar4 >> 0x10);
  uVar161 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar4));
  uVar85 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar161 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar52._8_4_ = 0;
  auVar52._0_8_ = uVar43;
  auVar52._12_2_ = uVar86;
  auVar52._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar161 >> 0x20);
  auVar216._12_4_ = auVar52._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar43;
  auVar216._10_2_ = uVar86;
  auVar112._10_6_ = auVar216._10_6_;
  auVar112._8_2_ = uVar86;
  auVar112._0_8_ = uVar43;
  uVar86 = (undefined2)uVar20;
  auVar22._4_8_ = auVar112._8_8_;
  auVar22._2_2_ = uVar86;
  auVar22._0_2_ = uVar86;
  fVar129 = (float)((int)sVar50 >> 8);
  fVar142 = (float)(auVar22._0_4_ >> 0x18);
  fVar143 = (float)(auVar112._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar41 * 6 + 6);
  uVar85 = (undefined1)((uint)uVar4 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar4 >> 0x10);
  uVar161 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar4));
  uVar85 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar161 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar55._8_4_ = 0;
  auVar55._0_8_ = uVar43;
  auVar55._12_2_ = uVar86;
  auVar55._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar161 >> 0x20);
  auVar54._12_4_ = auVar55._12_4_;
  auVar54._8_2_ = 0;
  auVar54._0_8_ = uVar43;
  auVar54._10_2_ = uVar86;
  auVar53._10_6_ = auVar54._10_6_;
  auVar53._8_2_ = uVar86;
  auVar53._0_8_ = uVar43;
  uVar86 = (undefined2)uVar20;
  auVar23._4_8_ = auVar53._8_8_;
  auVar23._2_2_ = uVar86;
  auVar23._0_2_ = uVar86;
  fVar144 = (float)((int)sVar50 >> 8);
  fVar158 = (float)(auVar23._0_4_ >> 0x18);
  fVar159 = (float)(auVar53._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar41 * 0xb + 6);
  uVar85 = (undefined1)((uint)uVar4 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar4 >> 0x10);
  uVar161 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar4));
  uVar85 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar161 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar58._8_4_ = 0;
  auVar58._0_8_ = uVar43;
  auVar58._12_2_ = uVar86;
  auVar58._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar161 >> 0x20);
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._8_2_ = 0;
  auVar57._0_8_ = uVar43;
  auVar57._10_2_ = uVar86;
  auVar56._10_6_ = auVar57._10_6_;
  auVar56._8_2_ = uVar86;
  auVar56._0_8_ = uVar43;
  uVar86 = (undefined2)uVar20;
  auVar24._4_8_ = auVar56._8_8_;
  auVar24._2_2_ = uVar86;
  auVar24._0_2_ = uVar86;
  fVar51 = (float)((int)sVar50 >> 8);
  fVar87 = (float)(auVar24._0_4_ >> 0x18);
  fVar88 = (float)(auVar56._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  uVar85 = (undefined1)((uint)uVar4 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar4 >> 0x10);
  uVar161 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar4));
  uVar85 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar161 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar164._8_4_ = 0;
  auVar164._0_8_ = uVar43;
  auVar164._12_2_ = uVar86;
  auVar164._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar161 >> 0x20);
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._8_2_ = 0;
  auVar163._0_8_ = uVar43;
  auVar163._10_2_ = uVar86;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._8_2_ = uVar86;
  auVar162._0_8_ = uVar43;
  uVar86 = (undefined2)uVar20;
  auVar25._4_8_ = auVar162._8_8_;
  auVar25._2_2_ = uVar86;
  auVar25._0_2_ = uVar86;
  fVar160 = (float)((int)sVar50 >> 8);
  fVar168 = (float)(auVar25._0_4_ >> 0x18);
  fVar169 = (float)(auVar162._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + (uint)(byte)PVar3 * 0xc + uVar41 + 6);
  uVar85 = (undefined1)((uint)uVar4 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar4 >> 0x10);
  uVar161 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar4));
  uVar85 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar161 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar173._8_4_ = 0;
  auVar173._0_8_ = uVar43;
  auVar173._12_2_ = uVar86;
  auVar173._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar161 >> 0x20);
  auVar172._12_4_ = auVar173._12_4_;
  auVar172._8_2_ = 0;
  auVar172._0_8_ = uVar43;
  auVar172._10_2_ = uVar86;
  auVar171._10_6_ = auVar172._10_6_;
  auVar171._8_2_ = uVar86;
  auVar171._0_8_ = uVar43;
  uVar86 = (undefined2)uVar20;
  auVar26._4_8_ = auVar171._8_8_;
  auVar26._2_2_ = uVar86;
  auVar26._0_2_ = uVar86;
  fVar212 = (float)((int)sVar50 >> 8);
  fVar222 = (float)(auVar26._0_4_ >> 0x18);
  fVar223 = (float)(auVar171._8_4_ >> 0x18);
  uVar39 = (ulong)(uint)((int)(uVar41 * 9) * 2);
  uVar4 = *(undefined4 *)(prim + uVar39 + 6);
  uVar85 = (undefined1)((uint)uVar4 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar4 >> 0x10);
  uVar161 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar4));
  uVar85 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar161 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar176._8_4_ = 0;
  auVar176._0_8_ = uVar43;
  auVar176._12_2_ = uVar86;
  auVar176._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar161 >> 0x20);
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar43;
  auVar175._10_2_ = uVar86;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._8_2_ = uVar86;
  auVar174._0_8_ = uVar43;
  uVar86 = (undefined2)uVar20;
  auVar27._4_8_ = auVar174._8_8_;
  auVar27._2_2_ = uVar86;
  auVar27._0_2_ = uVar86;
  fVar197 = (float)((int)sVar50 >> 8);
  fVar210 = (float)(auVar27._0_4_ >> 0x18);
  fVar211 = (float)(auVar174._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar39 + uVar41 + 6);
  uVar85 = (undefined1)((uint)uVar4 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar4 >> 0x10);
  uVar161 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar4));
  uVar85 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar161 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar43;
  auVar179._12_2_ = uVar86;
  auVar179._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar161 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar43;
  auVar178._10_2_ = uVar86;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar86;
  auVar177._0_8_ = uVar43;
  uVar86 = (undefined2)uVar20;
  auVar28._4_8_ = auVar177._8_8_;
  auVar28._2_2_ = uVar86;
  auVar28._0_2_ = uVar86;
  fVar224 = (float)((int)sVar50 >> 8);
  fVar231 = (float)(auVar28._0_4_ >> 0x18);
  fVar232 = (float)(auVar177._8_4_ >> 0x18);
  uVar39 = (ulong)(uint)((int)(uVar41 * 5) << 2);
  uVar4 = *(undefined4 *)(prim + uVar39 + 6);
  uVar85 = (undefined1)((uint)uVar4 >> 0x18);
  uVar86 = CONCAT11(uVar85,uVar85);
  uVar85 = (undefined1)((uint)uVar4 >> 0x10);
  uVar161 = CONCAT35(CONCAT21(uVar86,uVar85),CONCAT14(uVar85,uVar4));
  uVar85 = (undefined1)((uint)uVar4 >> 8);
  uVar20 = CONCAT51(CONCAT41((int)((ulong)uVar161 >> 0x20),uVar85),uVar85);
  sVar50 = CONCAT11((char)uVar4,(char)uVar4);
  uVar43 = CONCAT62(uVar20,sVar50);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar43;
  auVar182._12_2_ = uVar86;
  auVar182._14_2_ = uVar86;
  uVar86 = (undefined2)((ulong)uVar161 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar43;
  auVar181._10_2_ = uVar86;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar86;
  auVar180._0_8_ = uVar43;
  uVar86 = (undefined2)uVar20;
  auVar29._4_8_ = auVar180._8_8_;
  auVar29._2_2_ = uVar86;
  auVar29._0_2_ = uVar86;
  fVar257 = (float)((int)sVar50 >> 8);
  fVar261 = (float)(auVar29._0_4_ >> 0x18);
  fVar262 = (float)(auVar180._8_4_ >> 0x18);
  fVar244 = fVar89 * fVar109 + fVar107 * fVar129 + fVar108 * fVar144;
  fVar251 = fVar89 * fVar119 + fVar107 * fVar142 + fVar108 * fVar158;
  fVar253 = fVar89 * fVar120 + fVar107 * fVar143 + fVar108 * fVar159;
  fVar255 = fVar89 * (float)(auVar214._12_4_ >> 0x18) +
            fVar107 * (float)(auVar216._12_4_ >> 0x18) + fVar108 * (float)(auVar54._12_4_ >> 0x18);
  fVar233 = fVar89 * fVar51 + fVar107 * fVar160 + fVar108 * fVar212;
  fVar239 = fVar89 * fVar87 + fVar107 * fVar168 + fVar108 * fVar222;
  fVar240 = fVar89 * fVar88 + fVar107 * fVar169 + fVar108 * fVar223;
  fVar242 = fVar89 * (float)(auVar57._12_4_ >> 0x18) +
            fVar107 * (float)(auVar163._12_4_ >> 0x18) + fVar108 * (float)(auVar172._12_4_ >> 0x18);
  fVar170 = fVar89 * fVar197 + fVar107 * fVar224 + fVar108 * fVar257;
  fVar195 = fVar89 * fVar210 + fVar107 * fVar231 + fVar108 * fVar261;
  fVar196 = fVar89 * fVar211 + fVar107 * fVar232 + fVar108 * fVar262;
  fVar89 = fVar89 * (float)(auVar175._12_4_ >> 0x18) +
           fVar107 * (float)(auVar178._12_4_ >> 0x18) + fVar108 * (float)(auVar181._12_4_ >> 0x18);
  fVar110 = fVar109 * fVar122 + fVar129 * fVar127 + fVar144 * fVar128;
  fVar158 = fVar119 * fVar122 + fVar142 * fVar127 + fVar158 * fVar128;
  fVar159 = fVar120 * fVar122 + fVar143 * fVar127 + fVar159 * fVar128;
  fVar121 = (float)(auVar214._12_4_ >> 0x18) * fVar122 +
            (float)(auVar216._12_4_ >> 0x18) * fVar127 + (float)(auVar54._12_4_ >> 0x18) * fVar128;
  fVar160 = fVar51 * fVar122 + fVar160 * fVar127 + fVar212 * fVar128;
  fVar168 = fVar87 * fVar122 + fVar168 * fVar127 + fVar222 * fVar128;
  fVar169 = fVar88 * fVar122 + fVar169 * fVar127 + fVar223 * fVar128;
  fVar212 = (float)(auVar57._12_4_ >> 0x18) * fVar122 +
            (float)(auVar163._12_4_ >> 0x18) * fVar127 + (float)(auVar172._12_4_ >> 0x18) * fVar128;
  fVar129 = fVar122 * fVar197 + fVar127 * fVar224 + fVar128 * fVar257;
  fVar142 = fVar122 * fVar210 + fVar127 * fVar231 + fVar128 * fVar261;
  fVar143 = fVar122 * fVar211 + fVar127 * fVar232 + fVar128 * fVar262;
  fVar144 = fVar122 * (float)(auVar175._12_4_ >> 0x18) +
            fVar127 * (float)(auVar178._12_4_ >> 0x18) + fVar128 * (float)(auVar181._12_4_ >> 0x18);
  fVar108 = (float)DAT_01f80d30;
  fVar51 = DAT_01f80d30._4_4_;
  fVar87 = DAT_01f80d30._8_4_;
  fVar88 = DAT_01f80d30._12_4_;
  uVar44 = -(uint)(fVar108 <= ABS(fVar244));
  uVar46 = -(uint)(fVar51 <= ABS(fVar251));
  uVar48 = -(uint)(fVar87 <= ABS(fVar253));
  uVar49 = -(uint)(fVar88 <= ABS(fVar255));
  auVar247._0_4_ = (uint)fVar244 & uVar44;
  auVar247._4_4_ = (uint)fVar251 & uVar46;
  auVar247._8_4_ = (uint)fVar253 & uVar48;
  auVar247._12_4_ = (uint)fVar255 & uVar49;
  auVar123._0_4_ = ~uVar44 & (uint)fVar108;
  auVar123._4_4_ = ~uVar46 & (uint)fVar51;
  auVar123._8_4_ = ~uVar48 & (uint)fVar87;
  auVar123._12_4_ = ~uVar49 & (uint)fVar88;
  auVar123 = auVar123 | auVar247;
  uVar44 = -(uint)(fVar108 <= ABS(fVar233));
  uVar46 = -(uint)(fVar51 <= ABS(fVar239));
  uVar48 = -(uint)(fVar87 <= ABS(fVar240));
  uVar49 = -(uint)(fVar88 <= ABS(fVar242));
  auVar234._0_4_ = (uint)fVar233 & uVar44;
  auVar234._4_4_ = (uint)fVar239 & uVar46;
  auVar234._8_4_ = (uint)fVar240 & uVar48;
  auVar234._12_4_ = (uint)fVar242 & uVar49;
  auVar130._0_4_ = ~uVar44 & (uint)fVar108;
  auVar130._4_4_ = ~uVar46 & (uint)fVar51;
  auVar130._8_4_ = ~uVar48 & (uint)fVar87;
  auVar130._12_4_ = ~uVar49 & (uint)fVar88;
  auVar130 = auVar130 | auVar234;
  uVar44 = -(uint)(fVar108 <= ABS(fVar170));
  uVar46 = -(uint)(fVar51 <= ABS(fVar195));
  uVar48 = -(uint)(fVar87 <= ABS(fVar196));
  uVar49 = -(uint)(fVar88 <= ABS(fVar89));
  auVar183._0_4_ = (uint)fVar170 & uVar44;
  auVar183._4_4_ = (uint)fVar195 & uVar46;
  auVar183._8_4_ = (uint)fVar196 & uVar48;
  auVar183._12_4_ = (uint)fVar89 & uVar49;
  auVar165._0_4_ = ~uVar44 & (uint)fVar108;
  auVar165._4_4_ = ~uVar46 & (uint)fVar51;
  auVar165._8_4_ = ~uVar48 & (uint)fVar87;
  auVar165._12_4_ = ~uVar49 & (uint)fVar88;
  auVar165 = auVar165 | auVar183;
  auVar59 = rcpps(_DAT_01f80d30,auVar123);
  fVar108 = auVar59._0_4_;
  fVar88 = auVar59._4_4_;
  fVar109 = auVar59._8_4_;
  fVar122 = auVar59._12_4_;
  fVar108 = (1.0 - auVar123._0_4_ * fVar108) * fVar108 + fVar108;
  fVar88 = (1.0 - auVar123._4_4_ * fVar88) * fVar88 + fVar88;
  fVar109 = (1.0 - auVar123._8_4_ * fVar109) * fVar109 + fVar109;
  fVar122 = (1.0 - auVar123._12_4_ * fVar122) * fVar122 + fVar122;
  auVar59 = rcpps(auVar59,auVar130);
  fVar51 = auVar59._0_4_;
  fVar89 = auVar59._4_4_;
  fVar119 = auVar59._8_4_;
  fVar127 = auVar59._12_4_;
  fVar51 = (1.0 - auVar130._0_4_ * fVar51) * fVar51 + fVar51;
  fVar89 = (1.0 - auVar130._4_4_ * fVar89) * fVar89 + fVar89;
  fVar119 = (1.0 - auVar130._8_4_ * fVar119) * fVar119 + fVar119;
  fVar127 = (1.0 - auVar130._12_4_ * fVar127) * fVar127 + fVar127;
  auVar59 = rcpps(auVar59,auVar165);
  fVar87 = auVar59._0_4_;
  fVar107 = auVar59._4_4_;
  fVar120 = auVar59._8_4_;
  fVar128 = auVar59._12_4_;
  fVar87 = (1.0 - auVar165._0_4_ * fVar87) * fVar87 + fVar87;
  fVar107 = (1.0 - auVar165._4_4_ * fVar107) * fVar107 + fVar107;
  fVar120 = (1.0 - auVar165._8_4_ * fVar120) * fVar120 + fVar120;
  fVar128 = (1.0 - auVar165._12_4_ * fVar128) * fVar128 + fVar128;
  uVar43 = *(ulong *)(prim + uVar41 * 7 + 6);
  uVar86 = (undefined2)(uVar43 >> 0x30);
  auVar62._8_4_ = 0;
  auVar62._0_8_ = uVar43;
  auVar62._12_2_ = uVar86;
  auVar62._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar43 >> 0x20);
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar43;
  auVar61._10_2_ = uVar86;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._8_2_ = uVar86;
  auVar60._0_8_ = uVar43;
  uVar86 = (undefined2)(uVar43 >> 0x10);
  auVar30._4_8_ = auVar60._8_8_;
  auVar30._2_2_ = uVar86;
  auVar30._0_2_ = uVar86;
  auVar124._0_8_ =
       CONCAT44(((float)(auVar30._0_4_ >> 0x10) - fVar158) * fVar88,
                ((float)(int)(short)uVar43 - fVar110) * fVar108);
  auVar124._8_4_ = ((float)(auVar60._8_4_ >> 0x10) - fVar159) * fVar109;
  auVar124._12_4_ = ((float)(auVar61._12_4_ >> 0x10) - fVar121) * fVar122;
  uVar43 = *(ulong *)(prim + uVar41 * 9 + 6);
  uVar86 = (undefined2)(uVar43 >> 0x30);
  auVar65._8_4_ = 0;
  auVar65._0_8_ = uVar43;
  auVar65._12_2_ = uVar86;
  auVar65._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar43 >> 0x20);
  auVar64._12_4_ = auVar65._12_4_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar43;
  auVar64._10_2_ = uVar86;
  auVar63._10_6_ = auVar64._10_6_;
  auVar63._8_2_ = uVar86;
  auVar63._0_8_ = uVar43;
  uVar86 = (undefined2)(uVar43 >> 0x10);
  auVar31._4_8_ = auVar63._8_8_;
  auVar31._2_2_ = uVar86;
  auVar31._0_2_ = uVar86;
  auVar166._0_4_ = ((float)(int)(short)uVar43 - fVar110) * fVar108;
  auVar166._4_4_ = ((float)(auVar31._0_4_ >> 0x10) - fVar158) * fVar88;
  auVar166._8_4_ = ((float)(auVar63._8_4_ >> 0x10) - fVar159) * fVar109;
  auVar166._12_4_ = ((float)(auVar64._12_4_ >> 0x10) - fVar121) * fVar122;
  lVar37 = uVar39 + uVar41;
  uVar43 = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  uVar39 = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar41 * -2 + 6);
  uVar86 = (undefined2)(uVar39 >> 0x30);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar39;
  auVar186._12_2_ = uVar86;
  auVar186._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar39 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar39;
  auVar185._10_2_ = uVar86;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar86;
  auVar184._0_8_ = uVar39;
  uVar86 = (undefined2)(uVar39 >> 0x10);
  auVar32._4_8_ = auVar184._8_8_;
  auVar32._2_2_ = uVar86;
  auVar32._0_2_ = uVar86;
  auVar187._0_8_ =
       CONCAT44(((float)(auVar32._0_4_ >> 0x10) - fVar168) * fVar89,
                ((float)(int)(short)uVar39 - fVar160) * fVar51);
  auVar187._8_4_ = ((float)(auVar184._8_4_ >> 0x10) - fVar169) * fVar119;
  auVar187._12_4_ = ((float)(auVar185._12_4_ >> 0x10) - fVar212) * fVar127;
  uVar86 = (undefined2)(uVar43 >> 0x30);
  auVar68._8_4_ = 0;
  auVar68._0_8_ = uVar43;
  auVar68._12_2_ = uVar86;
  auVar68._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar43 >> 0x20);
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar43;
  auVar67._10_2_ = uVar86;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._8_2_ = uVar86;
  auVar66._0_8_ = uVar43;
  uVar86 = (undefined2)(uVar43 >> 0x10);
  auVar33._4_8_ = auVar66._8_8_;
  auVar33._2_2_ = uVar86;
  auVar33._0_2_ = uVar86;
  auVar69._0_4_ = ((float)(int)(short)uVar43 - fVar160) * fVar51;
  auVar69._4_4_ = ((float)(auVar33._0_4_ >> 0x10) - fVar168) * fVar89;
  auVar69._8_4_ = ((float)(auVar66._8_4_ >> 0x10) - fVar169) * fVar119;
  auVar69._12_4_ = ((float)(auVar67._12_4_ >> 0x10) - fVar212) * fVar127;
  uVar43 = *(ulong *)(prim + lVar37 + 6);
  uVar86 = (undefined2)(uVar43 >> 0x30);
  auVar147._8_4_ = 0;
  auVar147._0_8_ = uVar43;
  auVar147._12_2_ = uVar86;
  auVar147._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar43 >> 0x20);
  auVar146._12_4_ = auVar147._12_4_;
  auVar146._8_2_ = 0;
  auVar146._0_8_ = uVar43;
  auVar146._10_2_ = uVar86;
  auVar145._10_6_ = auVar146._10_6_;
  auVar145._8_2_ = uVar86;
  auVar145._0_8_ = uVar43;
  uVar86 = (undefined2)(uVar43 >> 0x10);
  auVar34._4_8_ = auVar145._8_8_;
  auVar34._2_2_ = uVar86;
  auVar34._0_2_ = uVar86;
  auVar148._0_8_ =
       CONCAT44(((float)(auVar34._0_4_ >> 0x10) - fVar142) * fVar107,
                ((float)(int)(short)uVar43 - fVar129) * fVar87);
  auVar148._8_4_ = ((float)(auVar145._8_4_ >> 0x10) - fVar143) * fVar120;
  auVar148._12_4_ = ((float)(auVar146._12_4_ >> 0x10) - fVar144) * fVar128;
  uVar43 = *(ulong *)(prim + uVar41 * 0x17 + 6);
  uVar86 = (undefined2)(uVar43 >> 0x30);
  auVar200._8_4_ = 0;
  auVar200._0_8_ = uVar43;
  auVar200._12_2_ = uVar86;
  auVar200._14_2_ = uVar86;
  uVar86 = (undefined2)(uVar43 >> 0x20);
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._8_2_ = 0;
  auVar199._0_8_ = uVar43;
  auVar199._10_2_ = uVar86;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._8_2_ = uVar86;
  auVar198._0_8_ = uVar43;
  uVar86 = (undefined2)(uVar43 >> 0x10);
  auVar35._4_8_ = auVar198._8_8_;
  auVar35._2_2_ = uVar86;
  auVar35._0_2_ = uVar86;
  auVar201._0_4_ = ((float)(int)(short)uVar43 - fVar129) * fVar87;
  auVar201._4_4_ = ((float)(auVar35._0_4_ >> 0x10) - fVar142) * fVar107;
  auVar201._8_4_ = ((float)(auVar198._8_4_ >> 0x10) - fVar143) * fVar120;
  auVar201._12_4_ = ((float)(auVar199._12_4_ >> 0x10) - fVar144) * fVar128;
  auVar213._8_4_ = auVar124._8_4_;
  auVar213._0_8_ = auVar124._0_8_;
  auVar213._12_4_ = auVar124._12_4_;
  auVar214 = minps(auVar213,auVar166);
  auVar90._8_4_ = auVar187._8_4_;
  auVar90._0_8_ = auVar187._0_8_;
  auVar90._12_4_ = auVar187._12_4_;
  auVar59 = minps(auVar90,auVar69);
  auVar214 = maxps(auVar214,auVar59);
  auVar91._8_4_ = auVar148._8_4_;
  auVar91._0_8_ = auVar148._0_8_;
  auVar91._12_4_ = auVar148._12_4_;
  auVar59 = minps(auVar91,auVar201);
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar131._4_4_ = uVar4;
  auVar131._0_4_ = uVar4;
  auVar131._8_4_ = uVar4;
  auVar131._12_4_ = uVar4;
  auVar59 = maxps(auVar59,auVar131);
  auVar59 = maxps(auVar214,auVar59);
  local_178 = auVar59._0_4_ * 0.99999964;
  fStack_174 = auVar59._4_4_ * 0.99999964;
  fStack_170 = auVar59._8_4_ * 0.99999964;
  fStack_16c = auVar59._12_4_ * 0.99999964;
  auVar59 = maxps(auVar124,auVar166);
  auVar214 = maxps(auVar187,auVar69);
  auVar59 = minps(auVar59,auVar214);
  auVar214 = maxps(auVar148,auVar201);
  fVar108 = ray->tfar;
  auVar70._4_4_ = fVar108;
  auVar70._0_4_ = fVar108;
  auVar70._8_4_ = fVar108;
  auVar70._12_4_ = fVar108;
  auVar214 = minps(auVar214,auVar70);
  auVar59 = minps(auVar59,auVar214);
  auVar92._0_4_ = -(uint)(PVar3 != (Primitive)0x0 && local_178 <= auVar59._0_4_ * 1.0000004);
  auVar92._4_4_ = -(uint)(1 < (byte)PVar3 && fStack_174 <= auVar59._4_4_ * 1.0000004);
  auVar92._8_4_ = -(uint)(2 < (byte)PVar3 && fStack_170 <= auVar59._8_4_ * 1.0000004);
  auVar92._12_4_ = -(uint)(3 < (byte)PVar3 && fStack_16c <= auVar59._12_4_ * 1.0000004);
  uVar44 = movmskps((int)lVar37,auVar92);
  if (uVar44 == 0) {
    return false;
  }
  uVar44 = uVar44 & 0xff;
  local_168._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_168._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_168._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_168._12_4_ = 0;
LAB_00a525d7:
  uVar43 = (ulong)uVar44;
  lVar37 = 0;
  if (uVar43 != 0) {
    for (; (uVar44 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
    }
  }
  local_3b0 = (ulong)*(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  uVar39 = *(ulong *)&pGVar5->field_0x58;
  _Var6 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  local_280 = (ulong)*(uint *)(prim + lVar37 * 4 + 6);
  uVar41 = (ulong)*(uint *)(uVar39 + _Var6 * *(uint *)(prim + lVar37 * 4 + 6));
  p_Var7 = pGVar5[1].intersectionFilterN;
  pvVar8 = pGVar5[2].userPtr;
  _Var9 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar2 = (float *)(_Var9 + uVar41 * (long)pvVar8);
  fVar108 = *pfVar2;
  fVar51 = pfVar2[1];
  fVar87 = pfVar2[2];
  fVar88 = pfVar2[3];
  pfVar2 = (float *)(_Var9 + (uVar41 + 1) * (long)pvVar8);
  fVar89 = *pfVar2;
  fVar107 = pfVar2[1];
  fVar109 = pfVar2[2];
  fVar119 = pfVar2[3];
  pfVar2 = (float *)(_Var9 + (uVar41 + 2) * (long)pvVar8);
  fVar120 = *pfVar2;
  fVar122 = pfVar2[1];
  fVar127 = pfVar2[2];
  fVar128 = pfVar2[3];
  pfVar2 = (float *)(_Var9 + (long)pvVar8 * (uVar41 + 3));
  fVar129 = *pfVar2;
  fVar142 = pfVar2[1];
  fVar143 = pfVar2[2];
  fVar144 = pfVar2[3];
  uVar43 = uVar43 - 1 & uVar43;
  lVar37 = *(long *)&pGVar5[1].time_range.upper;
  pfVar2 = (float *)(lVar37 + (long)p_Var7 * uVar41);
  fVar110 = *pfVar2;
  fVar158 = pfVar2[1];
  fVar159 = pfVar2[2];
  fVar121 = pfVar2[3];
  pfVar2 = (float *)(lVar37 + (long)p_Var7 * (uVar41 + 1));
  fVar160 = *pfVar2;
  fVar168 = pfVar2[1];
  fVar169 = pfVar2[2];
  fVar170 = pfVar2[3];
  pfVar2 = (float *)(lVar37 + (long)p_Var7 * (uVar41 + 2));
  fVar195 = *pfVar2;
  fVar196 = pfVar2[1];
  fVar197 = pfVar2[2];
  fVar210 = pfVar2[3];
  lVar10 = 0;
  if (uVar43 != 0) {
    for (; (uVar43 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  pfVar2 = (float *)(lVar37 + (long)p_Var7 * (uVar41 + 3));
  fVar211 = *pfVar2;
  fVar212 = pfVar2[1];
  fVar222 = pfVar2[2];
  fVar223 = pfVar2[3];
  if ((uVar43 != 0) && (uVar41 = uVar43 - 1 & uVar43, uVar41 != 0)) {
    lVar37 = 0;
    if (uVar41 != 0) {
      for (; (uVar41 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
      }
    }
    uVar39 = (ulong)*(uint *)(uVar39 + _Var6 * *(uint *)(prim + lVar37 * 4 + 6));
  }
  fVar224 = fVar110 * 0.16666667 + fVar160 * 0.6666667 + fVar195 * 0.16666667 + fVar211 * 0.0;
  fVar231 = fVar158 * 0.16666667 + fVar168 * 0.6666667 + fVar196 * 0.16666667 + fVar212 * 0.0;
  fVar232 = fVar159 * 0.16666667 + fVar169 * 0.6666667 + fVar197 * 0.16666667 + fVar222 * 0.0;
  fVar233 = fVar121 * 0.16666667 + fVar170 * 0.6666667 + fVar210 * 0.16666667 + fVar223 * 0.0;
  fVar239 = ((fVar195 * 0.5 + fVar211 * 0.0) - fVar160 * 0.0) - fVar110 * 0.5;
  fVar240 = ((fVar196 * 0.5 + fVar212 * 0.0) - fVar168 * 0.0) - fVar158 * 0.5;
  fVar242 = ((fVar197 * 0.5 + fVar222 * 0.0) - fVar169 * 0.0) - fVar159 * 0.5;
  fVar244 = ((fVar210 * 0.5 + fVar223 * 0.0) - fVar170 * 0.0) - fVar121 * 0.5;
  fVar245 = fVar108 * 0.16666667 + fVar89 * 0.6666667 + fVar120 * 0.16666667 + fVar129 * 0.0;
  fVar252 = fVar51 * 0.16666667 + fVar107 * 0.6666667 + fVar122 * 0.16666667 + fVar142 * 0.0;
  fVar254 = fVar87 * 0.16666667 + fVar109 * 0.6666667 + fVar127 * 0.16666667 + fVar143 * 0.0;
  fVar256 = fVar88 * 0.16666667 + fVar119 * 0.6666667 + fVar128 * 0.16666667 + fVar144 * 0.0;
  fVar261 = ((fVar120 * 0.5 + fVar129 * 0.0) - fVar89 * 0.0) - fVar108 * 0.5;
  fVar262 = ((fVar122 * 0.5 + fVar142 * 0.0) - fVar107 * 0.0) - fVar51 * 0.5;
  fVar241 = ((fVar127 * 0.5 + fVar143 * 0.0) - fVar109 * 0.0) - fVar87 * 0.5;
  fVar243 = ((fVar128 * 0.5 + fVar144 * 0.0) - fVar119 * 0.0) - fVar88 * 0.5;
  fVar251 = fVar160 * 0.16666667 + fVar195 * 0.6666667 + fVar211 * 0.16666667 + fVar110 * 0.0;
  fVar253 = fVar168 * 0.16666667 + fVar196 * 0.6666667 + fVar212 * 0.16666667 + fVar158 * 0.0;
  fVar255 = fVar169 * 0.16666667 + fVar197 * 0.6666667 + fVar222 * 0.16666667 + fVar159 * 0.0;
  fVar257 = fVar170 * 0.16666667 + fVar210 * 0.6666667 + fVar223 * 0.16666667 + fVar121 * 0.0;
  fVar110 = ((fVar195 * 0.0 + fVar211 * 0.5) - fVar160 * 0.5) - fVar110 * 0.0;
  fVar158 = ((fVar196 * 0.0 + fVar212 * 0.5) - fVar168 * 0.5) - fVar158 * 0.0;
  fVar159 = ((fVar197 * 0.0 + fVar222 * 0.5) - fVar169 * 0.5) - fVar159 * 0.0;
  fVar121 = ((fVar210 * 0.0 + fVar223 * 0.5) - fVar170 * 0.5) - fVar121 * 0.0;
  fVar160 = fVar89 * 0.16666667 + fVar120 * 0.6666667 + fVar129 * 0.16666667 + fVar108 * 0.0;
  fVar168 = fVar107 * 0.16666667 + fVar122 * 0.6666667 + fVar142 * 0.16666667 + fVar51 * 0.0;
  fVar169 = fVar109 * 0.16666667 + fVar127 * 0.6666667 + fVar143 * 0.16666667 + fVar87 * 0.0;
  fVar170 = fVar119 * 0.16666667 + fVar128 * 0.6666667 + fVar144 * 0.16666667 + fVar88 * 0.0;
  fVar108 = ((fVar120 * 0.0 + fVar129 * 0.5) - fVar89 * 0.5) - fVar108 * 0.0;
  fVar51 = ((fVar122 * 0.0 + fVar142 * 0.5) - fVar107 * 0.5) - fVar51 * 0.0;
  fVar87 = ((fVar127 * 0.0 + fVar143 * 0.5) - fVar109 * 0.5) - fVar87 * 0.0;
  fVar88 = ((fVar128 * 0.0 + fVar144 * 0.5) - fVar119 * 0.5) - fVar88 * 0.0;
  fVar195 = fVar240 * fVar245 - fVar252 * fVar239;
  fVar197 = fVar242 * fVar252 - fVar254 * fVar240;
  fVar210 = fVar239 * fVar254 - fVar245 * fVar242;
  fVar211 = fVar244 * fVar256 - fVar256 * fVar244;
  fVar128 = fVar240 * fVar261 - fVar262 * fVar239;
  fVar122 = fVar242 * fVar262 - fVar241 * fVar240;
  fVar127 = fVar239 * fVar241 - fVar261 * fVar242;
  fVar119 = fVar158 * fVar160 - fVar168 * fVar110;
  fVar142 = fVar159 * fVar168 - fVar169 * fVar158;
  fVar143 = fVar110 * fVar169 - fVar160 * fVar159;
  fVar144 = fVar121 * fVar170 - fVar170 * fVar121;
  fVar89 = fVar158 * fVar108 - fVar51 * fVar110;
  fVar51 = fVar159 * fVar51 - fVar87 * fVar158;
  fVar87 = fVar110 * fVar87 - fVar108 * fVar159;
  fVar168 = fVar210 * fVar210 + fVar197 * fVar197 + fVar195 * fVar195;
  auVar214 = ZEXT416((uint)fVar168);
  auVar59 = rsqrtss(ZEXT416((uint)fVar168),auVar214);
  fVar108 = auVar59._0_4_;
  fVar169 = fVar108 * 1.5 - fVar108 * fVar108 * fVar168 * 0.5 * fVar108;
  fVar196 = fVar195 * fVar128 + fVar210 * fVar127 + fVar197 * fVar122;
  fVar108 = fVar211 * fVar169;
  auVar59 = rcpss(auVar214,auVar214);
  fVar129 = (2.0 - fVar168 * auVar59._0_4_) * auVar59._0_4_;
  fVar160 = fVar143 * fVar143 + fVar142 * fVar142 + fVar119 * fVar119;
  auVar59 = ZEXT416((uint)fVar160);
  auVar214 = rsqrtss(ZEXT416((uint)fVar160),auVar59);
  fVar107 = auVar214._0_4_;
  fVar120 = fVar107 * 1.5 - fVar107 * fVar107 * fVar160 * 0.5 * fVar107;
  fVar170 = fVar119 * fVar89 + fVar143 * fVar87 + fVar142 * fVar51;
  fVar109 = fVar144 * fVar120;
  auVar59 = rcpss(auVar59,auVar59);
  fVar107 = (2.0 - fVar160 * auVar59._0_4_) * auVar59._0_4_;
  local_338 = fVar233 * fVar197 * fVar169;
  fStack_334 = fVar233 * fVar210 * fVar169;
  fStack_330 = fVar233 * fVar195 * fVar169;
  fStack_32c = fVar233 * fVar108;
  local_348 = fVar224 - local_338;
  fStack_344 = fVar231 - fStack_334;
  fStack_340 = fVar232 - fStack_330;
  fStack_33c = fVar233 - fStack_32c;
  fVar122 = fVar233 * fVar129 * (fVar168 * fVar122 - fVar196 * fVar197) * fVar169 +
            fVar244 * fVar197 * fVar169;
  fVar127 = fVar233 * fVar129 * (fVar168 * fVar127 - fVar196 * fVar210) * fVar169 +
            fVar244 * fVar210 * fVar169;
  fVar128 = fVar233 * fVar129 * (fVar168 * fVar128 - fVar196 * fVar195) * fVar169 +
            fVar244 * fVar195 * fVar169;
  fVar129 = fVar233 * fVar129 * (fVar168 * (fVar244 * fVar243 - fVar243 * fVar244) -
                                fVar196 * fVar211) * fVar169 + fVar244 * fVar108;
  local_338 = local_338 + fVar224;
  fStack_334 = fStack_334 + fVar231;
  fStack_330 = fStack_330 + fVar232;
  fStack_32c = fStack_32c + fVar233;
  local_398 = fVar257 * fVar142 * fVar120;
  fStack_394 = fVar257 * fVar143 * fVar120;
  fStack_390 = fVar257 * fVar119 * fVar120;
  fStack_38c = fVar257 * fVar109;
  local_368 = fVar251 - local_398;
  fStack_364 = fVar253 - fStack_394;
  fStack_360 = fVar255 - fStack_390;
  fStack_35c = fVar257 - fStack_38c;
  fVar108 = fVar257 * fVar107 * (fVar160 * fVar51 - fVar170 * fVar142) * fVar120 +
            fVar121 * fVar142 * fVar120;
  fVar51 = fVar257 * fVar107 * (fVar160 * fVar87 - fVar170 * fVar143) * fVar120 +
           fVar121 * fVar143 * fVar120;
  fVar87 = fVar257 * fVar107 * (fVar160 * fVar89 - fVar170 * fVar119) * fVar120 +
           fVar121 * fVar119 * fVar120;
  fVar88 = fVar257 * fVar107 * (fVar160 * (fVar121 * fVar88 - fVar88 * fVar121) - fVar170 * fVar144)
                     * fVar120 + fVar121 * fVar109;
  local_398 = local_398 + fVar251;
  fStack_394 = fStack_394 + fVar253;
  fStack_390 = fStack_390 + fVar255;
  fStack_38c = fStack_38c + fVar257;
  local_358 = (fVar239 - fVar122) * 0.33333334 + local_348;
  fStack_354 = (fVar240 - fVar127) * 0.33333334 + fStack_344;
  fStack_350 = (fVar242 - fVar128) * 0.33333334 + fStack_340;
  fStack_34c = (fVar244 - fVar129) * 0.33333334 + fStack_33c;
  local_378 = local_368 - (fVar110 - fVar108) * 0.33333334;
  fStack_374 = fStack_364 - (fVar158 - fVar51) * 0.33333334;
  fStack_370 = fStack_360 - (fVar159 - fVar87) * 0.33333334;
  fStack_36c = fStack_35c - (fVar121 - fVar88) * 0.33333334;
  local_3a8 = local_398 - (fVar108 + fVar110) * 0.33333334;
  fStack_3a4 = fStack_394 - (fVar51 + fVar158) * 0.33333334;
  fStack_3a0 = fStack_390 - (fVar87 + fVar159) * 0.33333334;
  fStack_39c = fStack_38c - (fVar88 + fVar121) * 0.33333334;
  fVar108 = (ray->org).field_0.m128[0];
  fVar51 = (ray->org).field_0.m128[1];
  fVar87 = (ray->org).field_0.m128[2];
  fVar88 = (pre->ray_space).vx.field_0.m128[0];
  fVar89 = (pre->ray_space).vx.field_0.m128[1];
  fVar107 = (pre->ray_space).vy.field_0.m128[0];
  fVar109 = (pre->ray_space).vy.field_0.m128[1];
  fVar119 = (pre->ray_space).vz.field_0.m128[0];
  fVar120 = (pre->ray_space).vz.field_0.m128[1];
  fVar160 = (local_348 - fVar108) * fVar88 +
            (fStack_344 - fVar51) * fVar107 + (fStack_340 - fVar87) * fVar119;
  fVar168 = (local_348 - fVar108) * fVar89 +
            (fStack_344 - fVar51) * fVar109 + (fStack_340 - fVar87) * fVar120;
  uVar258 = CONCAT44(fVar168,fVar160);
  fVar159 = (local_358 - fVar108) * fVar88 +
            (fStack_354 - fVar51) * fVar107 + (fStack_350 - fVar87) * fVar119;
  fVar121 = (local_358 - fVar108) * fVar89 +
            (fStack_354 - fVar51) * fVar109 + (fStack_350 - fVar87) * fVar120;
  uVar225 = CONCAT44(fVar121,fVar159);
  fVar144 = local_378 - fVar108;
  fVar110 = fStack_374 - fVar51;
  fVar158 = fStack_370 - fVar87;
  fVar142 = fVar144 * fVar88 + fVar110 * fVar107 + fVar158 * fVar119;
  fVar143 = fVar144 * fVar89 + fVar110 * fVar109 + fVar158 * fVar120;
  local_3e8 = fVar144 * (pre->ray_space).vx.field_0.m128[2] +
              fVar110 * (pre->ray_space).vy.field_0.m128[2] +
              fVar158 * (pre->ray_space).vz.field_0.m128[2];
  fStack_3e4 = fVar144 * (pre->ray_space).vx.field_0.m128[3] +
               fVar110 * (pre->ray_space).vy.field_0.m128[3] +
               fVar158 * (pre->ray_space).vz.field_0.m128[3];
  fVar144 = (local_368 - fVar108) * fVar88 +
            (fStack_364 - fVar51) * fVar107 + (fStack_360 - fVar87) * fVar119;
  fVar110 = (local_368 - fVar108) * fVar89 +
            (fStack_364 - fVar51) * fVar109 + (fStack_360 - fVar87) * fVar120;
  uVar246 = CONCAT44(fVar110,fVar144);
  fStack_288 = (local_338 - fVar108) * fVar88 +
               (fStack_334 - fVar51) * fVar107 + (fStack_330 - fVar87) * fVar119;
  fStack_284 = (local_338 - fVar108) * fVar89 +
               (fStack_334 - fVar51) * fVar109 + (fStack_330 - fVar87) * fVar120;
  local_328 = (fVar122 + fVar239) * 0.33333334 + local_338;
  fStack_324 = (fVar127 + fVar240) * 0.33333334 + fStack_334;
  fStack_320 = (fVar128 + fVar242) * 0.33333334 + fStack_330;
  fStack_31c = (fVar129 + fVar244) * 0.33333334 + fStack_32c;
  fVar122 = (local_328 - fVar108) * fVar88 +
            (fStack_324 - fVar51) * fVar107 + (fStack_320 - fVar87) * fVar119;
  fVar127 = (local_328 - fVar108) * fVar89 +
            (fStack_324 - fVar51) * fVar109 + (fStack_320 - fVar87) * fVar120;
  uVar161 = CONCAT44(fVar127,fVar122);
  local_308 = (local_3a8 - fVar108) * fVar88 +
              (fStack_3a4 - fVar51) * fVar107 + (fStack_3a0 - fVar87) * fVar119;
  fStack_304 = (local_3a8 - fVar108) * fVar89 +
               (fStack_3a4 - fVar51) * fVar109 + (fStack_3a0 - fVar87) * fVar120;
  fVar88 = (local_398 - fVar108) * fVar88 +
           (fStack_394 - fVar51) * fVar107 + (fStack_390 - fVar87) * fVar119;
  fVar108 = (local_398 - fVar108) * fVar89 +
            (fStack_394 - fVar51) * fVar109 + (fStack_390 - fVar87) * fVar120;
  local_318 = CONCAT44(fVar108,fVar88);
  register0x00001308 = uVar161;
  local_208 = uVar225;
  local_2a8 = CONCAT44(fVar143,fVar142);
  register0x00001408 = local_318;
  local_3c8 = uVar246;
  auVar71._8_4_ = fStack_288;
  auVar71._0_8_ = uVar258;
  auVar71._12_4_ = fStack_284;
  auVar59 = minps(auVar71,_local_208);
  auVar93._8_4_ = local_308;
  auVar93._0_8_ = local_2a8;
  auVar93._12_4_ = fStack_304;
  auVar214 = minps(auVar93,_local_3c8);
  auVar59 = minps(auVar59,auVar214);
  auVar94._4_4_ = fVar168;
  auVar94._0_4_ = fVar160;
  auVar94._8_4_ = fStack_288;
  auVar94._12_4_ = fStack_284;
  auVar214 = maxps(auVar94,_local_208);
  auVar111._8_4_ = local_308;
  auVar111._0_8_ = local_2a8;
  auVar111._12_4_ = fStack_304;
  auVar112 = maxps(auVar111,_local_3c8);
  auVar95 = maxps(auVar214,auVar112);
  auVar12._4_8_ = auVar112._8_8_;
  auVar12._0_4_ = auVar59._4_4_;
  auVar113._0_8_ = auVar12._0_8_ << 0x20;
  auVar113._8_4_ = auVar59._8_4_;
  auVar113._12_4_ = auVar59._12_4_;
  auVar114._8_8_ = auVar59._8_8_;
  auVar114._0_8_ = auVar113._8_8_;
  auVar214 = minps(auVar59,auVar114);
  auVar13._4_8_ = auVar59._8_8_;
  auVar13._0_4_ = auVar95._4_4_;
  auVar115._0_8_ = auVar13._0_8_ << 0x20;
  auVar115._8_4_ = auVar95._8_4_;
  auVar115._12_4_ = auVar95._12_4_;
  auVar116._8_8_ = auVar95._8_8_;
  auVar116._0_8_ = auVar115._8_8_;
  auVar59 = maxps(auVar95,auVar116);
  auVar72._0_8_ = auVar214._0_8_ & 0x7fffffff7fffffff;
  auVar72._8_4_ = auVar214._8_4_ & 0x7fffffff;
  auVar72._12_4_ = auVar214._12_4_ & 0x7fffffff;
  auVar96._0_8_ = auVar59._0_8_ & 0x7fffffff7fffffff;
  auVar96._8_4_ = auVar59._8_4_ & 0x7fffffff;
  auVar96._12_4_ = auVar59._12_4_ & 0x7fffffff;
  auVar59 = maxps(auVar72,auVar96);
  fStack_84 = auVar59._4_4_;
  local_88 = fStack_84;
  if (fStack_84 <= auVar59._0_4_) {
    local_88 = auVar59._0_4_;
  }
  local_88 = local_88 * 9.536743e-07;
  register0x00001488 = uVar258;
  local_2b8 = uVar258;
  register0x00001448 = uVar225;
  local_2c8 = uVar225;
  register0x00001348 = uVar246;
  local_2d8 = uVar246;
  register0x00001288 = uVar161;
  local_2f8 = uVar161;
  register0x00001548 = local_318;
  fStack_80 = fStack_84;
  fStack_7c = fStack_84;
  local_148 = local_88;
  fStack_144 = local_88;
  fStack_140 = local_88;
  fStack_13c = local_88;
  local_158 = -local_88;
  fStack_154 = -local_88;
  fStack_150 = -local_88;
  fStack_14c = -local_88;
  local_98 = fVar159 - fVar160;
  fStack_94 = fVar121 - fVar168;
  fStack_90 = fVar122 - fStack_288;
  fStack_8c = fVar127 - fStack_284;
  local_a8 = fVar142 - fVar159;
  fStack_a4 = fVar143 - fVar121;
  fStack_a0 = local_308 - fVar122;
  fStack_9c = fStack_304 - fVar127;
  _local_298 = CONCAT44(fStack_304,local_308);
  local_b8 = fVar144 - fVar142;
  fStack_b4 = fVar110 - fVar143;
  fStack_b0 = fVar88 - local_308;
  fStack_ac = fVar108 - fStack_304;
  local_188 = local_338 - local_348;
  fStack_184 = fStack_334 - fStack_344;
  fStack_180 = fStack_330 - fStack_340;
  fStack_17c = fStack_32c - fStack_33c;
  local_198 = local_328 - local_358;
  fStack_194 = fStack_324 - fStack_354;
  fStack_190 = fStack_320 - fStack_350;
  fStack_18c = fStack_31c - fStack_34c;
  local_1a8 = local_3a8 - local_378;
  fStack_1a4 = fStack_3a4 - fStack_374;
  fStack_1a0 = fStack_3a0 - fStack_370;
  fStack_19c = fStack_39c - fStack_36c;
  local_1b8 = local_398 - local_368;
  fStack_1b4 = fStack_394 - fStack_364;
  fStack_1b0 = fStack_390 - fStack_360;
  fStack_1ac = fStack_38c - fStack_35c;
  bVar36 = false;
  uVar41 = 0;
  fVar108 = 0.0;
  fVar51 = 1.0;
  local_3d8 = 0.0;
  fStack_3d4 = 1.0;
  fStack_3d0 = 0.0;
  fStack_3cc = 0.0;
  fStack_3e0 = local_3e8;
  fStack_3dc = fStack_3e4;
  local_2e8 = fStack_288;
  fStack_2e4 = fStack_284;
  fStack_2e0 = fStack_288;
  fStack_2dc = fStack_284;
  fStack_300 = local_308;
  fStack_2fc = fStack_304;
LAB_00a52e6e:
  do {
    fVar87 = 1.0 - fVar108;
    fVar88 = 1.0 - fVar108;
    fVar89 = 1.0 - fVar51;
    fVar107 = 1.0 - fVar51;
    fVar159 = local_2b8._0_4_ * fVar87 + local_2e8 * fVar108;
    fVar195 = local_2b8._4_4_ * fVar88 + fStack_2e4 * fVar108;
    fVar196 = local_2b8._8_4_ * fVar89 + fStack_2e0 * fVar51;
    fVar197 = local_2b8._12_4_ * fVar107 + fStack_2dc * fVar51;
    fVar122 = local_2c8._0_4_ * fVar87 + local_2f8._0_4_ * fVar108;
    fVar168 = local_2c8._4_4_ * fVar88 + local_2f8._4_4_ * fVar108;
    fVar169 = local_2c8._8_4_ * fVar89 + local_2f8._8_4_ * fVar51;
    fVar170 = local_2c8._12_4_ * fVar107 + local_2f8._12_4_ * fVar51;
    fVar212 = local_3e8 * fVar87 + local_308 * fVar108;
    fVar222 = fStack_3e4 * fVar88 + fStack_304 * fVar108;
    fVar244 = fStack_3e0 * fVar89 + fStack_300 * fVar51;
    fVar251 = fStack_3dc * fVar107 + fStack_2fc * fVar51;
    fVar210 = fVar87 * local_2d8._0_4_ + fVar108 * local_318._0_4_;
    fVar211 = fVar88 * local_2d8._4_4_ + fVar108 * local_318._4_4_;
    fVar224 = fVar89 * local_2d8._8_4_ + fVar51 * local_318._8_4_;
    fVar231 = fVar107 * local_2d8._12_4_ + fVar51 * local_318._12_4_;
    fVar232 = (fStack_3d4 - local_3d8) * 0.11111111;
    fVar233 = (fStack_3d4 - local_3d8) * 0.0 + local_3d8;
    fVar239 = (fStack_3d4 - local_3d8) * 0.33333334 + local_3d8;
    fVar240 = (fStack_3d4 - local_3d8) * 0.6666667 + local_3d8;
    fVar242 = (fStack_3d4 - local_3d8) * 1.0 + local_3d8;
    fVar88 = 1.0 - fVar233;
    fVar107 = 1.0 - fVar239;
    fVar109 = 1.0 - fVar240;
    fVar119 = 1.0 - fVar242;
    fVar127 = fVar122 * fVar88 + fVar212 * fVar233;
    fVar128 = fVar122 * fVar107 + fVar212 * fVar239;
    fVar129 = fVar122 * fVar109 + fVar212 * fVar240;
    fVar142 = fVar122 * fVar119 + fVar212 * fVar242;
    fVar143 = fVar168 * fVar88 + fVar222 * fVar233;
    fVar144 = fVar168 * fVar107 + fVar222 * fVar239;
    fVar110 = fVar168 * fVar109 + fVar222 * fVar240;
    fVar158 = fVar168 * fVar119 + fVar222 * fVar242;
    fVar87 = (fVar159 * fVar88 + fVar122 * fVar233) * fVar88 + fVar233 * fVar127;
    fVar89 = (fVar159 * fVar107 + fVar122 * fVar239) * fVar107 + fVar239 * fVar128;
    fVar120 = (fVar159 * fVar109 + fVar122 * fVar240) * fVar109 + fVar240 * fVar129;
    fVar122 = (fVar159 * fVar119 + fVar122 * fVar242) * fVar119 + fVar242 * fVar142;
    fVar159 = (fVar195 * fVar88 + fVar168 * fVar233) * fVar88 + fVar233 * fVar143;
    fVar121 = (fVar195 * fVar107 + fVar168 * fVar239) * fVar107 + fVar239 * fVar144;
    fVar160 = (fVar195 * fVar109 + fVar168 * fVar240) * fVar109 + fVar240 * fVar110;
    fVar168 = (fVar195 * fVar119 + fVar168 * fVar242) * fVar119 + fVar242 * fVar158;
    fVar127 = fVar127 * fVar88 + (fVar212 * fVar88 + fVar210 * fVar233) * fVar233;
    fVar128 = fVar128 * fVar107 + (fVar212 * fVar107 + fVar210 * fVar239) * fVar239;
    fVar129 = fVar129 * fVar109 + (fVar212 * fVar109 + fVar210 * fVar240) * fVar240;
    fVar142 = fVar142 * fVar119 + (fVar212 * fVar119 + fVar210 * fVar242) * fVar242;
    fVar143 = fVar143 * fVar88 + (fVar222 * fVar88 + fVar211 * fVar233) * fVar233;
    fVar144 = fVar144 * fVar107 + (fVar222 * fVar107 + fVar211 * fVar239) * fVar239;
    fVar110 = fVar110 * fVar109 + (fVar222 * fVar109 + fVar211 * fVar240) * fVar240;
    fVar158 = fVar158 * fVar119 + (fVar222 * fVar119 + fVar211 * fVar242) * fVar242;
    local_248 = fVar88 * fVar87 + fVar233 * fVar127;
    fStack_244 = fVar107 * fVar89 + fVar239 * fVar128;
    fStack_240 = fVar109 * fVar120 + fVar240 * fVar129;
    fStack_23c = fVar119 * fVar122 + fVar242 * fVar142;
    local_138 = fVar88 * fVar159 + fVar233 * fVar143;
    fStack_134 = fVar107 * fVar121 + fVar239 * fVar144;
    fStack_130 = fVar109 * fVar160 + fVar240 * fVar110;
    fStack_12c = fVar119 * fVar168 + fVar242 * fVar158;
    fVar128 = (fVar128 - fVar89) * 3.0 * fVar232;
    fVar120 = (fVar129 - fVar120) * 3.0 * fVar232;
    fVar122 = (fVar142 - fVar122) * 3.0 * fVar232;
    fVar129 = (fVar144 - fVar121) * 3.0 * fVar232;
    fVar142 = (fVar110 - fVar160) * 3.0 * fVar232;
    fVar144 = (fVar158 - fVar168) * 3.0 * fVar232;
    local_218._4_4_ = fStack_240;
    local_218._0_4_ = fStack_244;
    local_218._8_4_ = fStack_23c;
    local_218._12_4_ = 0;
    local_d8._4_4_ = fStack_130;
    local_d8._0_4_ = fStack_134;
    local_228 = local_248 + (fVar127 - fVar87) * 3.0 * fVar232;
    fStack_224 = fStack_244 + fVar128;
    fStack_220 = fStack_240 + fVar120;
    fStack_21c = fStack_23c + fVar122;
    fVar87 = local_138 + (fVar143 - fVar159) * 3.0 * fVar232;
    fVar89 = fStack_134 + fVar129;
    fStack_380 = fStack_130 + fVar142;
    fStack_37c = fStack_12c + fVar144;
    local_388 = CONCAT44(fVar89,fVar87);
    local_238._0_4_ = fStack_244 - fVar128;
    local_238._4_4_ = fStack_240 - fVar120;
    local_238._8_4_ = fStack_23c - fVar122;
    local_238._12_4_ = 0;
    local_418._0_4_ = fStack_134 - fVar129;
    local_418._4_4_ = fStack_130 - fVar142;
    fStack_410 = fStack_12c - fVar144;
    fStack_40c = 0.0;
    fVar120 = fVar169 * fVar88 + fVar244 * fVar233;
    fVar122 = fVar169 * fVar107 + fVar244 * fVar239;
    fVar127 = fVar169 * fVar109 + fVar244 * fVar240;
    fVar128 = fVar169 * fVar119 + fVar244 * fVar242;
    fVar129 = fVar170 * fVar88 + fVar251 * fVar233;
    fVar142 = fVar170 * fVar107 + fVar251 * fVar239;
    fVar143 = fVar170 * fVar109 + fVar251 * fVar240;
    fVar144 = fVar170 * fVar119 + fVar251 * fVar242;
    fVar110 = (fVar196 * fVar88 + fVar169 * fVar233) * fVar88 + fVar233 * fVar120;
    fVar158 = (fVar196 * fVar107 + fVar169 * fVar239) * fVar107 + fVar239 * fVar122;
    fVar159 = (fVar196 * fVar109 + fVar169 * fVar240) * fVar109 + fVar240 * fVar127;
    fVar121 = (fVar196 * fVar119 + fVar169 * fVar242) * fVar119 + fVar242 * fVar128;
    fVar211 = (fVar197 * fVar88 + fVar170 * fVar233) * fVar88 + fVar233 * fVar129;
    fVar212 = (fVar197 * fVar107 + fVar170 * fVar239) * fVar107 + fVar239 * fVar142;
    fVar222 = (fVar197 * fVar109 + fVar170 * fVar240) * fVar109 + fVar240 * fVar143;
    fVar223 = (fVar197 * fVar119 + fVar170 * fVar242) * fVar119 + fVar242 * fVar144;
    fVar160 = fVar120 * fVar88 + (fVar244 * fVar88 + fVar224 * fVar233) * fVar233;
    fVar168 = fVar122 * fVar107 + (fVar244 * fVar107 + fVar224 * fVar239) * fVar239;
    fVar169 = fVar127 * fVar109 + (fVar244 * fVar109 + fVar224 * fVar240) * fVar240;
    fVar170 = fVar128 * fVar119 + (fVar244 * fVar119 + fVar224 * fVar242) * fVar242;
    fVar195 = fVar129 * fVar88 + (fVar251 * fVar88 + fVar231 * fVar233) * fVar233;
    fVar196 = fVar142 * fVar107 + (fVar251 * fVar107 + fVar231 * fVar239) * fVar239;
    fVar197 = fVar143 * fVar109 + (fVar251 * fVar109 + fVar231 * fVar240) * fVar240;
    fVar210 = fVar144 * fVar119 + (fVar251 * fVar119 + fVar231 * fVar242) * fVar242;
    fVar129 = fVar88 * fVar110 + fVar233 * fVar160;
    fVar142 = fVar107 * fVar158 + fVar239 * fVar168;
    fVar143 = fVar109 * fVar159 + fVar240 * fVar169;
    fVar144 = fVar119 * fVar121 + fVar242 * fVar170;
    fVar120 = fVar88 * fVar211 + fVar233 * fVar195;
    fVar122 = fVar107 * fVar212 + fVar239 * fVar196;
    fVar127 = fVar109 * fVar222 + fVar240 * fVar197;
    fVar128 = fVar119 * fVar223 + fVar242 * fVar210;
    fVar88 = (fVar168 - fVar158) * 3.0 * fVar232;
    fVar107 = (fVar169 - fVar159) * 3.0 * fVar232;
    fVar109 = (fVar170 - fVar121) * 3.0 * fVar232;
    fVar119 = (fVar196 - fVar212) * 3.0 * fVar232;
    fVar158 = (fVar197 - fVar222) * 3.0 * fVar232;
    fVar159 = (fVar210 - fVar223) * 3.0 * fVar232;
    local_e8._4_4_ = fVar143;
    local_e8._0_4_ = fVar142;
    local_e8._8_4_ = fVar144;
    local_e8._12_4_ = 0;
    local_108._4_4_ = fVar127;
    local_108._0_4_ = fVar122;
    local_108._8_4_ = fVar128;
    local_108._12_4_ = 0;
    local_128 = fVar129 + (fVar160 - fVar110) * 3.0 * fVar232;
    fStack_124 = fVar142 + fVar88;
    fStack_120 = fVar143 + fVar107;
    fStack_11c = fVar144 + fVar109;
    local_f8 = fVar120 + (fVar195 - fVar211) * 3.0 * fVar232;
    fStack_f4 = fVar122 + fVar119;
    fStack_f0 = fVar127 + fVar158;
    fStack_ec = fVar128 + fVar159;
    local_c8._0_4_ = fVar142 - fVar88;
    local_c8._4_4_ = fVar143 - fVar107;
    local_c8._8_4_ = fVar144 - fVar109;
    local_c8._12_4_ = 0;
    local_118._0_4_ = fVar122 - fVar119;
    local_118._4_4_ = fVar127 - fVar158;
    local_118._8_4_ = fVar128 - fVar159;
    local_118._12_4_ = 0;
    fVar88 = (fVar142 - fStack_244) + (fVar129 - local_248);
    fVar107 = (fVar143 - fStack_240) + (fVar142 - fStack_244);
    fVar109 = (fVar144 - fStack_23c) + (fVar143 - fStack_240);
    fVar119 = (fVar144 - fStack_23c) + 0.0;
    local_d8._8_4_ = fStack_12c;
    local_d8._12_4_ = 0;
    fVar110 = (fVar122 - fStack_134) + (fVar120 - local_138);
    fVar158 = (fVar127 - fStack_130) + (fVar122 - fStack_134);
    fVar159 = (fVar128 - fStack_12c) + (fVar127 - fStack_130);
    fVar121 = (fVar128 - fStack_12c) + 0.0;
    auVar188._0_8_ =
         CONCAT44(fStack_134 * fVar107 - fStack_244 * fVar158,
                  local_138 * fVar88 - local_248 * fVar110);
    auVar188._8_4_ = fStack_130 * fVar109 - fStack_240 * fVar159;
    auVar188._12_4_ = fStack_12c * fVar119 - fStack_23c * fVar121;
    auVar132._0_4_ = fVar87 * fVar88 - local_228 * fVar110;
    auVar132._4_4_ = fVar89 * fVar107 - fStack_224 * fVar158;
    auVar132._8_4_ = fStack_380 * fVar109 - fStack_220 * fVar159;
    auVar132._12_4_ = fStack_37c * fVar119 - fStack_21c * fVar121;
    auVar149._0_8_ =
         CONCAT44((float)local_418._4_4_ * fVar107 - fVar158 * local_238._4_4_,
                  (float)local_418._0_4_ * fVar88 - fVar110 * local_238._0_4_);
    auVar149._8_4_ = fStack_410 * fVar109 - fVar159 * local_238._8_4_;
    auVar149._12_4_ = fVar119 * 0.0 - fVar121 * 0.0;
    auVar248._0_4_ = fVar88 * fStack_134 - fVar110 * fStack_244;
    auVar248._4_4_ = fVar107 * fStack_130 - fVar158 * fStack_240;
    auVar248._8_4_ = fVar109 * fStack_12c - fVar159 * fStack_23c;
    auVar248._12_4_ = fVar119 * 0.0 - fVar121 * 0.0;
    auVar215._0_8_ =
         CONCAT44(fVar122 * fVar107 - fVar142 * fVar158,fVar120 * fVar88 - fVar129 * fVar110);
    auVar215._8_4_ = fVar127 * fVar109 - fVar143 * fVar159;
    auVar215._12_4_ = fVar128 * fVar119 - fVar144 * fVar121;
    auVar259._0_4_ = local_f8 * fVar88 - local_128 * fVar110;
    auVar259._4_4_ = fStack_f4 * fVar107 - fStack_124 * fVar158;
    auVar259._8_4_ = fStack_f0 * fVar109 - fStack_120 * fVar159;
    auVar259._12_4_ = fStack_ec * fVar119 - fStack_11c * fVar121;
    auVar202._0_8_ =
         CONCAT44(local_118._4_4_ * fVar107 - fVar158 * local_c8._4_4_,
                  local_118._0_4_ * fVar88 - fVar110 * local_c8._0_4_);
    auVar202._8_4_ = local_118._8_4_ * fVar109 - fVar159 * local_c8._8_4_;
    auVar202._12_4_ = fVar119 * 0.0 - fVar121 * 0.0;
    auVar73._0_4_ = fVar88 * fVar122 - fVar110 * fVar142;
    auVar73._4_4_ = fVar107 * fVar127 - fVar158 * fVar143;
    auVar73._8_4_ = fVar109 * fVar128 - fVar159 * fVar144;
    auVar73._12_4_ = fVar119 * 0.0 - fVar121 * 0.0;
    auVar97._8_4_ = auVar188._8_4_;
    auVar97._0_8_ = auVar188._0_8_;
    auVar97._12_4_ = auVar188._12_4_;
    auVar59 = minps(auVar97,auVar132);
    auVar95 = maxps(auVar188,auVar132);
    auVar133._8_4_ = auVar149._8_4_;
    auVar133._0_8_ = auVar149._0_8_;
    auVar133._12_4_ = auVar149._12_4_;
    auVar214 = minps(auVar133,auVar248);
    auVar59 = minps(auVar59,auVar214);
    auVar214 = maxps(auVar149,auVar248);
    auVar112 = maxps(auVar95,auVar214);
    auVar134._8_4_ = auVar215._8_4_;
    auVar134._0_8_ = auVar215._0_8_;
    auVar134._12_4_ = auVar215._12_4_;
    auVar214 = minps(auVar134,auVar259);
    auVar216 = maxps(auVar215,auVar259);
    auVar150._8_4_ = auVar202._8_4_;
    auVar150._0_8_ = auVar202._0_8_;
    auVar150._12_4_ = auVar202._12_4_;
    auVar95 = minps(auVar150,auVar73);
    auVar214 = minps(auVar214,auVar95);
    auVar59 = minps(auVar59,auVar214);
    auVar214 = maxps(auVar202,auVar73);
    auVar214 = maxps(auVar216,auVar214);
    auVar214 = maxps(auVar112,auVar214);
    auVar189._0_4_ =
         -(uint)(local_158 <= auVar214._0_4_ && auVar59._0_4_ <= local_148) & local_168._0_4_;
    auVar189._4_4_ =
         -(uint)(fStack_154 <= auVar214._4_4_ && auVar59._4_4_ <= fStack_144) & local_168._4_4_;
    auVar189._8_4_ =
         -(uint)(fStack_150 <= auVar214._8_4_ && auVar59._8_4_ <= fStack_140) & local_168._8_4_;
    auVar189._12_4_ =
         -(uint)(fStack_14c <= auVar214._12_4_ && auVar59._12_4_ <= fStack_13c) & local_168._12_4_;
    uVar44 = movmskps((int)uVar39,auVar189);
    if (uVar44 == 0) goto LAB_00a534e4;
    fVar88 = (fVar142 - fVar129) + (fStack_244 - local_248);
    fVar107 = (fVar143 - fVar142) + (fStack_240 - fStack_244);
    fVar109 = (fVar144 - fVar143) + (fStack_23c - fStack_240);
    fVar119 = (0.0 - fVar144) + (0.0 - fStack_23c);
    fVar110 = (fVar122 - fVar120) + (fStack_134 - local_138);
    fVar158 = (fVar127 - fVar122) + (fStack_130 - fStack_134);
    fVar159 = (fVar128 - fVar127) + (fStack_12c - fStack_130);
    fVar121 = (0.0 - fVar128) + (0.0 - fStack_12c);
    auVar263._0_8_ =
         CONCAT44(fStack_134 * fVar107 - fStack_244 * fVar158,
                  local_138 * fVar88 - local_248 * fVar110);
    auVar263._8_4_ = fStack_130 * fVar109 - fStack_240 * fVar159;
    auVar263._12_4_ = fStack_12c * fVar119 - fStack_23c * fVar121;
    auVar135._0_4_ = fVar87 * fVar88 - local_228 * fVar110;
    auVar135._4_4_ = fVar89 * fVar107 - fStack_224 * fVar158;
    auVar135._8_4_ = fStack_380 * fVar109 - fStack_220 * fVar159;
    auVar135._12_4_ = fStack_37c * fVar119 - fStack_21c * fVar121;
    auVar203._0_8_ =
         CONCAT44((float)local_418._4_4_ * fVar107 - local_238._4_4_ * fVar158,
                  (float)local_418._0_4_ * fVar88 - local_238._0_4_ * fVar110);
    auVar203._8_4_ = fStack_410 * fVar109 - local_238._8_4_ * fVar159;
    auVar203._12_4_ = fVar119 * 0.0 - fVar121 * 0.0;
    auVar151._0_4_ = fStack_134 * fVar88 - fStack_244 * fVar110;
    auVar151._4_4_ = fStack_130 * fVar107 - fStack_240 * fVar158;
    auVar151._8_4_ = fStack_12c * fVar109 - fStack_23c * fVar159;
    auVar151._12_4_ = fVar119 * 0.0 - fVar121 * 0.0;
    auVar117._0_8_ =
         CONCAT44(fVar122 * fVar107 - fVar142 * fVar158,fVar120 * fVar88 - fVar129 * fVar110);
    auVar117._8_4_ = fVar127 * fVar109 - fVar143 * fVar159;
    auVar117._12_4_ = fVar128 * fVar119 - fVar144 * fVar121;
    auVar226._0_4_ = local_f8 * fVar88 - local_128 * fVar110;
    auVar226._4_4_ = fStack_f4 * fVar107 - fStack_124 * fVar158;
    auVar226._8_4_ = fStack_f0 * fVar109 - fStack_120 * fVar159;
    auVar226._12_4_ = fStack_ec * fVar119 - fStack_11c * fVar121;
    auVar249._0_8_ =
         CONCAT44(local_118._4_4_ * fVar107 - local_c8._4_4_ * fVar158,
                  local_118._0_4_ * fVar88 - local_c8._0_4_ * fVar110);
    auVar249._8_4_ = local_118._8_4_ * fVar109 - local_c8._8_4_ * fVar159;
    auVar249._12_4_ = fVar119 * 0.0 - fVar121 * 0.0;
    auVar74._0_4_ = fVar88 * fVar122 - fVar110 * fVar142;
    auVar74._4_4_ = fVar107 * fVar127 - fVar158 * fVar143;
    auVar74._8_4_ = fVar109 * fVar128 - fVar159 * fVar144;
    auVar74._12_4_ = fVar119 * 0.0 - fVar121 * 0.0;
    auVar98._8_4_ = auVar263._8_4_;
    auVar98._0_8_ = auVar263._0_8_;
    auVar98._12_4_ = auVar263._12_4_;
    auVar59 = minps(auVar98,auVar135);
    auVar95 = maxps(auVar263,auVar135);
    auVar136._8_4_ = auVar203._8_4_;
    auVar136._0_8_ = auVar203._0_8_;
    auVar136._12_4_ = auVar203._12_4_;
    auVar214 = minps(auVar136,auVar151);
    auVar59 = minps(auVar59,auVar214);
    auVar214 = maxps(auVar203,auVar151);
    auVar216 = maxps(auVar95,auVar214);
    auVar137._8_4_ = auVar117._8_4_;
    auVar137._0_8_ = auVar117._0_8_;
    auVar137._12_4_ = auVar117._12_4_;
    auVar95 = minps(auVar137,auVar226);
    auVar214 = maxps(auVar117,auVar226);
    auVar152._8_4_ = auVar249._8_4_;
    auVar152._0_8_ = auVar249._0_8_;
    auVar152._12_4_ = auVar249._12_4_;
    auVar112 = minps(auVar152,auVar74);
    auVar95 = minps(auVar95,auVar112);
    auVar59 = minps(auVar59,auVar95);
    auVar95 = maxps(auVar249,auVar74);
    auVar214 = maxps(auVar214,auVar95);
    auVar214 = maxps(auVar216,auVar214);
    auVar264._0_4_ =
         -(uint)(local_158 <= auVar214._0_4_ && auVar59._0_4_ <= local_148) & auVar189._0_4_;
    auVar264._4_4_ =
         -(uint)(fStack_154 <= auVar214._4_4_ && auVar59._4_4_ <= fStack_144) & auVar189._4_4_;
    auVar264._8_4_ =
         -(uint)(fStack_150 <= auVar214._8_4_ && auVar59._8_4_ <= fStack_140) & auVar189._8_4_;
    auVar264._12_4_ =
         -(uint)(fStack_14c <= auVar214._12_4_ && auVar59._12_4_ <= fStack_13c) & auVar189._12_4_;
    uVar44 = movmskps(uVar44,auVar264);
    uVar39 = (ulong)uVar44;
    if (uVar44 != 0) {
      auStack_1f8[uVar41] = uVar44 & 0xff;
      *(ulong *)(afStack_78 + uVar41 * 2) = CONCAT44(fStack_3d4,local_3d8);
      *(ulong *)(afStack_58 + uVar41 * 2) = CONCAT44(fVar51,fVar108);
      uVar39 = uVar41;
      uVar41 = (ulong)((int)uVar41 + 1);
    }
LAB_00a534f5:
    auVar59 = _local_418;
    if ((int)uVar41 == 0) {
      if (bVar36 != false) {
        return bVar36;
      }
      fVar108 = ray->tfar;
      auVar106._4_4_ = -(uint)(fStack_174 <= fVar108);
      auVar106._0_4_ = -(uint)(local_178 <= fVar108);
      auVar106._8_4_ = -(uint)(fStack_170 <= fVar108);
      auVar106._12_4_ = -(uint)(fStack_16c <= fVar108);
      uVar44 = movmskps((int)uVar39,auVar106);
      uVar44 = (uint)uVar43 & uVar44;
      if (uVar44 == 0) {
        return false;
      }
      goto LAB_00a525d7;
    }
    uVar42 = (ulong)((int)uVar41 - 1);
    uVar44 = auStack_1f8[uVar42];
    fVar108 = afStack_58[uVar42 * 2];
    fVar51 = afStack_58[uVar42 * 2 + 1];
    uVar11 = 0;
    if (uVar44 != 0) {
      for (; (uVar44 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
      }
    }
    uVar44 = uVar44 - 1 & uVar44;
    auStack_1f8[uVar42] = uVar44;
    if (uVar44 == 0) {
      uVar41 = uVar42;
    }
    uVar38 = uVar11 + 1;
    uVar39 = uVar38;
    if ((long)uVar38 < 0) {
      uVar39 = (ulong)((uint)uVar38 & 1) | uVar38 >> 1;
    }
    fVar87 = afStack_78[uVar42 * 2];
    fVar88 = afStack_78[uVar42 * 2 + 1];
    local_3d8 = fVar87 * (1.0 - (float)uVar11 * 0.33333334) + fVar88 * (float)uVar11 * 0.33333334;
    fStack_3d4 = fVar87 * (1.0 - (float)uVar38 * 0.33333334) + fVar88 * (float)uVar38 * 0.33333334;
    fStack_3d0 = fVar87 * 0.0 + fVar88 * 0.0;
    fStack_3cc = fVar87 * 0.0 + fVar88 * 0.0;
    fVar87 = fStack_3d4 - local_3d8;
    if (fVar87 < 0.16666667) {
      fVar128 = 1.0 - fVar108;
      fVar129 = 1.0 - fVar108;
      fVar142 = 1.0 - fVar51;
      fVar143 = 1.0 - fVar51;
      fVar88 = (float)local_2b8._0_4_ * fVar128 + local_2e8 * fVar108;
      fVar89 = (float)local_2b8._4_4_ * fVar129 + fStack_2e4 * fVar108;
      fVar107 = fStack_2b0 * fVar142 + fStack_2e0 * fVar51;
      fVar109 = fStack_2ac * fVar143 + fStack_2dc * fVar51;
      fVar119 = (float)local_2c8._0_4_ * fVar128 + (float)local_2f8._0_4_ * fVar108;
      fVar120 = (float)local_2c8._4_4_ * fVar129 + (float)local_2f8._4_4_ * fVar108;
      fVar122 = fStack_2c0 * fVar142 + fStack_2f0 * fVar51;
      fVar127 = fStack_2bc * fVar143 + fStack_2ec * fVar51;
      fVar196 = local_3e8 * fVar128 + local_308 * fVar108;
      fVar210 = fStack_3e4 * fVar129 + fStack_304 * fVar108;
      fVar212 = fStack_3e0 * fVar142 + fStack_300 * fVar51;
      fVar223 = fStack_3dc * fVar143 + fStack_2fc * fVar51;
      fVar168 = (fVar128 * (float)local_2d8._0_4_ + fVar108 * (float)local_318._0_4_) - fVar196;
      fVar169 = (fVar129 * (float)local_2d8._4_4_ + fVar108 * (float)local_318._4_4_) - fVar210;
      fVar170 = (fVar142 * fStack_2d0 + fVar51 * fStack_310) - fVar212;
      fVar195 = (fVar143 * fStack_2cc + fVar51 * fStack_30c) - fVar223;
      fVar144 = local_3d8 * (fVar196 - fVar119) + fVar119;
      fVar110 = local_3d8 * (fVar210 - fVar120) + fVar120;
      fVar121 = local_3d8 * (fVar212 - fVar122) + fVar122;
      fVar160 = local_3d8 * (fVar223 - fVar127) + fVar127;
      fVar197 = (fVar196 - fVar119) * fStack_3d4 + fVar119;
      fVar211 = (fVar210 - fVar120) * fStack_3d4 + fVar120;
      fVar222 = (fVar212 - fVar122) * fStack_3d4 + fVar122;
      fVar224 = (fVar223 - fVar127) * fStack_3d4 + fVar127;
      fVar128 = local_3d8 * (fVar119 - fVar88) + fVar88;
      fVar129 = local_3d8 * (fVar120 - fVar89) + fVar89;
      fVar142 = local_3d8 * (fVar122 - fVar107) + fVar107;
      fVar143 = local_3d8 * (fVar127 - fVar109) + fVar109;
      fVar128 = (fVar144 - fVar128) * local_3d8 + fVar128;
      fVar129 = (fVar110 - fVar129) * local_3d8 + fVar129;
      fVar142 = (fVar121 - fVar142) * local_3d8 + fVar142;
      fVar143 = (fVar160 - fVar143) * local_3d8 + fVar143;
      fVar158 = (((local_3d8 * fVar168 + fVar196) - fVar144) * local_3d8 + fVar144) - fVar128;
      fVar159 = (((local_3d8 * fVar169 + fVar210) - fVar110) * local_3d8 + fVar110) - fVar129;
      fVar121 = (((local_3d8 * fVar170 + fVar212) - fVar121) * local_3d8 + fVar121) - fVar142;
      fVar160 = (((local_3d8 * fVar195 + fVar223) - fVar160) * local_3d8 + fVar160) - fVar143;
      fVar128 = local_3d8 * fVar158 + fVar128;
      fVar129 = local_3d8 * fVar159 + fVar129;
      fVar142 = local_3d8 * fVar121 + fVar142;
      fVar143 = local_3d8 * fVar160 + fVar143;
      auVar99._0_4_ = (fVar119 - fVar88) * fStack_3d4 + fVar88;
      auVar99._4_4_ = (fVar120 - fVar89) * fStack_3d4 + fVar89;
      auVar99._8_4_ = (fVar122 - fVar107) * fStack_3d4 + fVar107;
      auVar99._12_4_ = (fVar127 - fVar109) * fStack_3d4 + fVar109;
      fVar144 = (fVar197 - auVar99._0_4_) * fStack_3d4 + auVar99._0_4_;
      fVar110 = (fVar211 - auVar99._4_4_) * fStack_3d4 + auVar99._4_4_;
      local_378 = (fVar222 - auVar99._8_4_) * fStack_3d4 + auVar99._8_4_;
      fStack_374 = (fVar224 - auVar99._12_4_) * fStack_3d4 + auVar99._12_4_;
      fVar89 = (((fVar168 * fStack_3d4 + fVar196) - fVar197) * fStack_3d4 + fVar197) - fVar144;
      fVar107 = (((fVar169 * fStack_3d4 + fVar210) - fVar211) * fStack_3d4 + fVar211) - fVar110;
      fVar109 = (((fVar170 * fStack_3d4 + fVar212) - fVar222) * fStack_3d4 + fVar222) - local_378;
      fVar119 = (((fVar195 * fStack_3d4 + fVar223) - fVar224) * fStack_3d4 + fVar224) - fStack_374;
      fVar144 = fStack_3d4 * fVar89 + fVar144;
      fVar110 = fStack_3d4 * fVar107 + fVar110;
      local_378 = fStack_3d4 * fVar109 + local_378;
      fStack_374 = fStack_3d4 * fVar119 + fStack_374;
      fVar88 = fVar87 * 0.33333334;
      fVar158 = fVar158 * (float)DAT_01f7ff50 * fVar88 + fVar128;
      fVar159 = fVar159 * DAT_01f7ff50._4_4_ * fVar88 + fVar129;
      fVar121 = fVar121 * DAT_01f7ff50._8_4_ * fVar88 + fVar142;
      fVar160 = fVar160 * DAT_01f7ff50._12_4_ * fVar88 + fVar143;
      fVar168 = fVar144 - fVar88 * fVar89 * (float)DAT_01f7ff50;
      fVar169 = fVar110 - fVar88 * fVar107 * DAT_01f7ff50._4_4_;
      fVar170 = local_378 - fVar88 * fVar109 * DAT_01f7ff50._8_4_;
      fVar195 = fStack_374 - fVar88 * fVar119 * DAT_01f7ff50._12_4_;
      auVar14._4_8_ = auVar99._8_8_;
      auVar14._0_4_ = fVar129;
      auVar100._0_8_ = auVar14._0_8_ << 0x20;
      auVar100._8_4_ = fVar142;
      auVar100._12_4_ = fVar143;
      auVar15._4_8_ = DAT_01f7ff50._8_8_;
      auVar15._0_4_ = fVar110;
      auVar204._0_8_ = auVar15._0_8_ << 0x20;
      auVar204._8_4_ = local_378;
      auVar204._12_4_ = fStack_374;
      local_418 = (undefined1  [8])auVar100._8_8_;
      fVar119 = (local_378 - fVar144) + (fVar142 - fVar128);
      fVar120 = (fStack_374 - fVar110) + (fVar143 - fVar129);
      auVar217._0_4_ = fVar169 * fVar120;
      auVar217._4_4_ = fVar169 * fVar120;
      auVar217._8_4_ = fVar195 * fVar120;
      auVar217._12_4_ = fVar195 * fVar120;
      fVar88 = fVar128 * fVar119 + fVar129 * fVar120;
      fVar89 = fVar142 * fVar119 + fVar143 * fVar120;
      fVar122 = fVar158 * fVar119 + fVar159 * fVar120;
      fVar127 = fVar121 * fVar119 + fVar160 * fVar120;
      fVar196 = fVar168 * fVar119 + auVar217._0_4_;
      auVar190._0_8_ = CONCAT44(fVar169 * fVar119 + auVar217._4_4_,fVar196);
      auVar190._8_4_ = fVar170 * fVar119 + auVar217._8_4_;
      auVar190._12_4_ = fVar195 * fVar119 + auVar217._12_4_;
      fVar109 = fVar119 * fVar144 + fVar120 * fVar110;
      fVar197 = fVar119 * local_378 + fVar120 * fStack_374;
      auVar16._4_8_ = auVar217._8_8_;
      auVar16._0_4_ = fVar159 * fVar119 + fVar159 * fVar120;
      auVar218._0_8_ = auVar16._0_8_ << 0x20;
      auVar218._8_4_ = fVar127;
      auVar218._12_4_ = fVar160 * fVar119 + fVar160 * fVar120;
      fVar107 = fVar122;
      if (fVar122 <= fVar88) {
        fVar107 = fVar88;
        fVar88 = fVar122;
      }
      auVar219._8_8_ = auVar218._8_8_;
      auVar219._0_8_ = auVar219._8_8_;
      auVar75._8_4_ = auVar190._8_4_;
      auVar75._0_8_ = auVar190._0_8_;
      auVar75._12_4_ = auVar190._12_4_;
      if (fVar109 <= fVar196) {
        auVar75._0_4_ = fVar109;
      }
      if (auVar75._0_4_ <= fVar88) {
        fVar88 = auVar75._0_4_;
      }
      auVar17._4_8_ = auVar75._8_8_;
      auVar17._0_4_ = fVar119 * fVar110 + fVar120 * fVar110;
      auVar76._0_8_ = auVar17._0_8_ << 0x20;
      auVar76._8_4_ = fVar197;
      auVar76._12_4_ = fVar119 * fStack_374 + fVar120 * fStack_374;
      if (fVar109 <= fVar196) {
        fVar109 = fVar196;
      }
      auVar77._8_8_ = auVar76._8_8_;
      auVar77._0_8_ = auVar77._8_8_;
      if (fVar109 <= fVar107) {
        fVar109 = fVar107;
      }
      if (fVar127 <= fVar89) {
        auVar219._0_4_ = fVar89;
        fVar89 = fVar127;
      }
      auVar101._8_4_ = auVar190._8_4_;
      auVar101._0_8_ = auVar190._8_8_;
      auVar101._12_4_ = auVar190._12_4_;
      if (fVar197 <= auVar190._8_4_) {
        auVar101._0_4_ = fVar197;
      }
      if (auVar101._0_4_ <= fVar89) {
        fVar89 = auVar101._0_4_;
      }
      if (fVar197 <= auVar190._8_4_) {
        auVar77._0_4_ = auVar190._8_4_;
      }
      if (auVar77._0_4_ <= auVar219._0_4_) {
        auVar77._0_4_ = auVar219._0_4_;
      }
      fVar107 = auVar77._0_4_;
      if ((0.0001 <= fVar88) || (fVar107 <= -0.0001)) break;
      goto LAB_00a5385c;
    }
  } while( true );
  if ((fVar89 < 0.0001 && -0.0001 < fVar109) ||
     ((fVar88 < 0.0001 && -0.0001 < fVar109 ||
      (uVar39 = CONCAT71((int7)(uVar39 >> 8),fVar87 < 0.001), fVar89 < 0.0001 && -0.0001 < fVar107))
     )) {
LAB_00a5385c:
    local_388 = auVar204._8_8_;
    fVar120 = (float)(~-(uint)(fVar88 < 0.0) & 0x3f800000 | -(uint)(fVar88 < 0.0) & 0xbf800000);
    fVar122 = (float)(~-(uint)(fVar109 < 0.0) & 0x3f800000 | -(uint)(fVar109 < 0.0) & 0xbf800000);
    fVar119 = 0.0;
    if ((fVar120 == fVar122) && (!NAN(fVar120) && !NAN(fVar122))) {
      fVar119 = INFINITY;
    }
    fVar127 = 0.0;
    if ((fVar120 == fVar122) && (!NAN(fVar120) && !NAN(fVar122))) {
      fVar127 = -INFINITY;
    }
    fVar196 = (float)(~-(uint)(fVar89 < 0.0) & 0x3f800000 | -(uint)(fVar89 < 0.0) & 0xbf800000);
    if ((fVar120 != fVar196) || (fVar197 = fVar127, NAN(fVar120) || NAN(fVar196))) {
      if ((fVar89 != fVar88) || (NAN(fVar89) || NAN(fVar88))) {
        fVar89 = -fVar88 / (fVar89 - fVar88);
        fVar89 = (1.0 - fVar89) * 0.0 + fVar89;
        fVar197 = fVar89;
      }
      else {
        fVar89 = 0.0;
        if ((fVar88 != 0.0) || (fVar197 = 1.0, NAN(fVar88))) {
          fVar89 = INFINITY;
          fVar197 = -INFINITY;
        }
      }
      if (fVar89 <= fVar119) {
        fVar119 = fVar89;
      }
      if (fVar197 <= fVar127) {
        fVar197 = fVar127;
      }
    }
    uVar39 = (ulong)(fVar107 < 0.0);
    fVar88 = *(float *)(&DAT_01f80eb4 + uVar39 * 4);
    if ((fVar122 != fVar88) || (fVar89 = fVar197, NAN(fVar122) || NAN(fVar88))) {
      if ((fVar107 != fVar109) || (NAN(fVar107) || NAN(fVar109))) {
        fVar120 = -fVar109 / (fVar107 - fVar109);
        fVar120 = (1.0 - fVar120) * 0.0 + fVar120;
        fVar89 = fVar120;
      }
      else {
        fVar120 = 0.0;
        if ((fVar109 != 0.0) || (fVar89 = 1.0, NAN(fVar109))) {
          fVar120 = INFINITY;
          fVar89 = -INFINITY;
        }
      }
      if (fVar120 <= fVar119) {
        fVar119 = fVar120;
      }
      if (fVar89 <= fVar197) {
        fVar89 = fVar197;
      }
    }
    if ((fVar196 != fVar88) || (NAN(fVar196) || NAN(fVar88))) {
      fVar119 = (float)(~-(uint)(fVar119 < 1.0) & 0x3f800000 |
                       (uint)fVar119 & -(uint)(fVar119 < 1.0));
      fVar89 = (float)(~-(uint)(fVar89 < 1.0) & (uint)fVar89 | -(uint)(fVar89 < 1.0) & 0x3f800000);
    }
    fVar119 = (float)(~-(uint)(fVar119 < 0.0) & (uint)fVar119);
    fVar88 = (float)(~-(uint)(fVar89 < 1.0) & 0x3f800000 | (uint)fVar89 & -(uint)(fVar89 < 1.0));
    if (fVar119 <= fVar88) {
      fVar119 = fVar119 + -0.1;
      fVar88 = fVar88 + 0.1;
      uVar44 = -(uint)(fVar88 < 1.0);
      fVar119 = (float)(~-(uint)(fVar119 < 0.0) & (uint)fVar119);
      fVar88 = (float)(~uVar44 & 0x3f800000 | (uint)fVar88 & uVar44);
      fVar196 = 1.0 - fVar119;
      fVar197 = 1.0 - fVar119;
      fVar210 = 1.0 - fVar88;
      fVar211 = 1.0 - fVar88;
      fStack_410 = auVar59._8_4_;
      fStack_40c = auVar59._12_4_;
      fVar89 = fVar128 * fVar196 + fVar142 * fVar119;
      fVar109 = fVar129 * fVar197 + fVar143 * fVar119;
      fVar120 = fVar128 * fVar210 + fStack_410 * fVar88;
      fVar122 = fVar129 * fVar211 + fStack_40c * fVar88;
      fVar127 = fVar158 * fVar196 + fVar121 * fVar119;
      fVar128 = fVar159 * fVar197 + fVar160 * fVar119;
      fVar129 = fVar158 * fVar210 + fVar121 * fVar88;
      fVar142 = fVar159 * fVar211 + fVar160 * fVar88;
      fVar143 = fVar168 * fVar196 + fVar170 * fVar119;
      fVar158 = fVar169 * fVar197 + fVar195 * fVar119;
      fVar159 = fVar168 * fVar210 + fVar170 * fVar88;
      fVar121 = fVar169 * fVar211 + fVar195 * fVar88;
      fVar160 = fVar196 * fVar144 + local_378 * fVar119;
      fVar168 = fVar197 * fVar110 + fStack_374 * fVar119;
      fVar144 = fVar210 * fVar144 + fStack_380 * fVar88;
      fVar169 = fVar211 * fVar110 + fStack_37c * fVar88;
      fVar110 = fVar108 * (1.0 - fVar88);
      fVar108 = fVar108 * (1.0 - fVar119) + fVar51 * fVar119;
      fVar51 = fVar110 + fVar51 * fVar88;
      fVar110 = 1.0 / fVar87;
      auVar102._0_4_ = fVar144 - fVar160;
      auVar102._4_4_ = fVar169 - fVar168;
      auVar102._8_4_ = fVar144 - fVar144;
      auVar102._12_4_ = fVar169 - fVar169;
      auVar125._0_8_ = CONCAT44(fVar121 - fVar158,fVar159 - fVar143);
      auVar125._8_4_ = fVar159 - fVar159;
      auVar125._12_4_ = fVar121 - fVar121;
      auVar153._0_4_ = fVar129 - fVar127;
      auVar153._4_4_ = fVar142 - fVar128;
      auVar153._8_4_ = fVar129 - fVar129;
      auVar153._12_4_ = fVar142 - fVar142;
      auVar220._0_8_ = CONCAT44((fVar128 - fVar109) * 3.0,(fVar127 - fVar89) * 3.0);
      auVar220._8_4_ = (fVar129 - fVar120) * 3.0;
      auVar220._12_4_ = (fVar142 - fVar122) * 3.0;
      auVar138._0_8_ = CONCAT44((fVar158 - fVar128) * 3.0,(fVar143 - fVar127) * 3.0);
      auVar138._8_4_ = (fVar159 - fVar129) * 3.0;
      auVar138._12_4_ = (fVar121 - fVar142) * 3.0;
      auVar235._0_4_ = (fVar160 - fVar143) * 3.0;
      auVar235._4_4_ = (fVar168 - fVar158) * 3.0;
      auVar235._8_4_ = (fVar144 - fVar159) * 3.0;
      auVar235._12_4_ = (fVar169 - fVar121) * 3.0;
      auVar191._8_4_ = auVar138._8_4_;
      auVar191._0_8_ = auVar138._0_8_;
      auVar191._12_4_ = auVar138._12_4_;
      auVar214 = minps(auVar191,auVar235);
      auVar59 = maxps(auVar138,auVar235);
      auVar227._8_4_ = auVar220._8_4_;
      auVar227._0_8_ = auVar220._0_8_;
      auVar227._12_4_ = auVar220._12_4_;
      auVar112 = minps(auVar227,auVar214);
      auVar95 = maxps(auVar220,auVar59);
      auVar18._4_8_ = auVar59._8_8_;
      auVar18._0_4_ = auVar112._4_4_;
      auVar139._0_8_ = auVar18._0_8_ << 0x20;
      auVar139._8_4_ = auVar112._8_4_;
      auVar139._12_4_ = auVar112._12_4_;
      auVar140._8_8_ = auVar112._8_8_;
      auVar140._0_8_ = auVar139._8_8_;
      auVar19._4_8_ = auVar214._8_8_;
      auVar19._0_4_ = auVar95._4_4_;
      auVar192._0_8_ = auVar19._0_8_ << 0x20;
      auVar192._8_4_ = auVar95._8_4_;
      auVar192._12_4_ = auVar95._12_4_;
      auVar193._8_8_ = auVar95._8_8_;
      auVar193._0_8_ = auVar192._8_8_;
      auVar214 = minps(auVar112,auVar140);
      auVar59 = maxps(auVar95,auVar193);
      fVar211 = auVar214._0_4_ * fVar110;
      fVar212 = auVar214._4_4_ * fVar110;
      fVar222 = auVar214._8_4_ * fVar110;
      fVar223 = auVar214._12_4_ * fVar110;
      fVar158 = fVar110 * auVar59._0_4_;
      fVar121 = fVar110 * auVar59._4_4_;
      fVar168 = fVar110 * auVar59._8_4_;
      fVar110 = fVar110 * auVar59._12_4_;
      fVar197 = 1.0 / (fVar51 - fVar108);
      auVar78._0_8_ = CONCAT44(fVar122 - fVar109,fVar120 - fVar89);
      auVar78._8_4_ = fVar120 - fVar120;
      auVar78._12_4_ = fVar122 - fVar122;
      auVar205._8_4_ = auVar78._8_4_;
      auVar205._0_8_ = auVar78._0_8_;
      auVar205._12_4_ = auVar78._12_4_;
      auVar95 = minps(auVar205,auVar153);
      auVar59 = maxps(auVar78,auVar153);
      auVar118._8_4_ = auVar125._8_4_;
      auVar118._0_8_ = auVar125._0_8_;
      auVar118._12_4_ = auVar125._12_4_;
      auVar214 = minps(auVar118,auVar102);
      auVar95 = minps(auVar95,auVar214);
      auVar214 = maxps(auVar125,auVar102);
      auVar59 = maxps(auVar59,auVar214);
      fVar195 = auVar95._0_4_ * fVar197;
      fVar196 = auVar95._4_4_ * fVar197;
      fVar210 = fVar197 * auVar59._0_4_;
      fVar197 = fVar197 * auVar59._4_4_;
      local_418._4_4_ = fVar108;
      local_418._0_4_ = local_3d8;
      fStack_410 = fStack_3d4;
      fStack_40c = fVar51;
      auVar194._4_4_ = fVar51;
      auVar194._0_4_ = fStack_3d4;
      auVar194._8_4_ = fStack_3d0;
      auVar194._12_4_ = fStack_3cc;
      local_1dc = (local_3d8 + fStack_3d4) * 0.5;
      fVar129 = (fVar108 + fVar51) * 0.5;
      fVar142 = (fStack_3d4 + fStack_3d0) * 0.0;
      fVar143 = (fVar51 + fStack_3cc) * 0.0;
      fVar88 = local_98 * local_1dc + local_298;
      fVar89 = fStack_94 * local_1dc + fStack_294;
      fVar109 = fStack_90 * local_1dc + fStack_290;
      fVar119 = fStack_8c * local_1dc + fStack_28c;
      fVar120 = local_a8 * local_1dc + (float)local_208._0_4_;
      fVar122 = fStack_a4 * local_1dc + (float)local_208._4_4_;
      fVar127 = fStack_a0 * local_1dc + fStack_200;
      fVar128 = fStack_9c * local_1dc + fStack_1fc;
      fVar88 = (fVar120 - fVar88) * local_1dc + fVar88;
      fVar89 = (fVar122 - fVar89) * local_1dc + fVar89;
      fVar109 = (fVar127 - fVar109) * local_1dc + fVar109;
      fVar119 = (fVar128 - fVar119) * local_1dc + fVar119;
      fVar120 = (((local_b8 * local_1dc + (float)local_2a8) - fVar120) * local_1dc + fVar120) -
                fVar88;
      fVar122 = (((fStack_b4 * local_1dc + local_2a8._4_4_) - fVar122) * local_1dc + fVar122) -
                fVar89;
      fVar127 = (((fStack_b0 * local_1dc + fStack_2a0) - fVar127) * local_1dc + fVar127) - fVar109;
      fVar128 = (((fStack_ac * local_1dc + fStack_29c) - fVar128) * local_1dc + fVar128) - fVar119;
      fVar88 = local_1dc * fVar120 + fVar88;
      fVar89 = local_1dc * fVar122 + fVar89;
      fVar120 = fVar120 * 3.0;
      fVar122 = fVar122 * 3.0;
      fVar109 = (local_1dc * fVar127 + fVar109) - fVar88;
      fVar119 = (local_1dc * fVar128 + fVar119) - fVar89;
      fVar120 = (fVar127 * 3.0 - fVar120) * fVar129 + fVar120;
      fVar122 = (fVar128 * 3.0 - fVar122) * fVar129 + fVar122;
      auVar126._0_8_ = CONCAT44(fVar120,fVar109) ^ 0x80000000;
      auVar126._8_4_ = fVar120;
      auVar126._12_4_ = fVar120;
      fVar224 = local_3d8 - local_1dc;
      fVar231 = fVar108 - fVar129;
      fVar232 = fStack_3d4 - fVar142;
      fVar233 = fVar51 - fVar143;
      fVar239 = fStack_3d4 - local_1dc;
      fVar240 = fVar51 - fVar129;
      fVar142 = fStack_3d0 - fVar142;
      fVar143 = fStack_3cc - fVar143;
      fVar88 = fVar109 * fVar129 + fVar88;
      fVar89 = fVar119 * fVar129 + fVar89;
      auVar141._0_8_ = CONCAT44(fVar122,fVar119) ^ 0x8000000000000000;
      auVar141._8_4_ = -fVar122;
      auVar141._12_4_ = -fVar122;
      auVar79._0_4_ = fVar119 * fVar120 - fVar122 * fVar109;
      auVar79._4_4_ = auVar79._0_4_;
      auVar79._8_4_ = auVar79._0_4_;
      auVar79._12_4_ = auVar79._0_4_;
      auVar214 = divps(auVar141,auVar79);
      auVar59 = divps(auVar126,auVar79);
      fVar128 = auVar214._0_4_;
      fVar144 = auVar214._4_4_;
      fVar122 = auVar59._0_4_;
      fVar127 = auVar59._4_4_;
      local_1dc = local_1dc - (fVar89 * fVar122 + fVar88 * fVar128);
      fStack_1d8 = fVar129 - (fVar89 * fVar127 + fVar88 * fVar144);
      fVar120 = fVar129 - (fVar89 * auVar59._8_4_ + fVar88 * auVar214._8_4_);
      fVar129 = fVar129 - (fVar89 * auVar59._12_4_ + fVar88 * auVar214._12_4_);
      auVar103._0_8_ = CONCAT44(fVar144 * fVar195,fVar144 * fVar211);
      auVar103._8_4_ = fVar144 * fVar212;
      auVar103._12_4_ = fVar144 * fVar196;
      auVar80._0_4_ = fVar144 * fVar158;
      auVar80._4_4_ = fVar144 * fVar210;
      auVar80._8_4_ = fVar144 * fVar121;
      auVar80._12_4_ = fVar144 * fVar197;
      auVar266._8_4_ = auVar103._8_4_;
      auVar266._0_8_ = auVar103._0_8_;
      auVar266._12_4_ = auVar103._12_4_;
      auVar112 = minps(auVar266,auVar80);
      auVar59 = maxps(auVar80,auVar103);
      auVar154._0_8_ = CONCAT44(fVar127 * fVar196,fVar127 * fVar212);
      auVar154._8_4_ = fVar127 * fVar222;
      auVar154._12_4_ = fVar127 * fVar223;
      auVar104._0_4_ = fVar127 * fVar121;
      auVar104._4_4_ = fVar127 * fVar197;
      auVar104._8_4_ = fVar127 * fVar168;
      auVar104._12_4_ = fVar127 * fVar110;
      auVar228._8_4_ = auVar154._8_4_;
      auVar228._0_8_ = auVar154._0_8_;
      auVar228._12_4_ = auVar154._12_4_;
      auVar95 = minps(auVar228,auVar104);
      auVar214 = maxps(auVar104,auVar154);
      fVar88 = 0.0 - (auVar214._0_4_ + auVar59._0_4_);
      fVar89 = 1.0 - (auVar214._4_4_ + auVar59._4_4_);
      fVar109 = 0.0 - (auVar214._8_4_ + auVar59._8_4_);
      fVar119 = 0.0 - (auVar214._12_4_ + auVar59._12_4_);
      fVar159 = 0.0 - (auVar95._0_4_ + auVar112._0_4_);
      fVar160 = 1.0 - (auVar95._4_4_ + auVar112._4_4_);
      fVar169 = 0.0 - (auVar95._8_4_ + auVar112._8_4_);
      fVar170 = 0.0 - (auVar95._12_4_ + auVar112._12_4_);
      auVar105._0_8_ = CONCAT44(fVar231 * fVar89,fVar224 * fVar88);
      auVar105._8_4_ = fVar232 * fVar109;
      auVar105._12_4_ = fVar233 * fVar119;
      auVar236._0_8_ = CONCAT44(fVar195 * fVar128,fVar211 * fVar128);
      auVar236._8_4_ = fVar212 * fVar128;
      auVar236._12_4_ = fVar196 * fVar128;
      auVar155._0_4_ = fVar128 * fVar158;
      auVar155._4_4_ = fVar128 * fVar210;
      auVar155._8_4_ = fVar128 * fVar121;
      auVar155._12_4_ = fVar128 * fVar197;
      auVar229._8_4_ = auVar236._8_4_;
      auVar229._0_8_ = auVar236._0_8_;
      auVar229._12_4_ = auVar236._12_4_;
      auVar214 = minps(auVar229,auVar155);
      auVar59 = maxps(auVar155,auVar236);
      auVar206._0_8_ = CONCAT44(fVar196 * fVar122,fVar212 * fVar122);
      auVar206._8_4_ = fVar222 * fVar122;
      auVar206._12_4_ = fVar223 * fVar122;
      auVar237._0_4_ = fVar122 * fVar121;
      auVar237._4_4_ = fVar122 * fVar197;
      auVar237._8_4_ = fVar122 * fVar168;
      auVar237._12_4_ = fVar122 * fVar110;
      auVar265._8_4_ = auVar206._8_4_;
      auVar265._0_8_ = auVar206._0_8_;
      auVar265._12_4_ = auVar206._12_4_;
      auVar112 = minps(auVar265,auVar237);
      auVar230._0_4_ = fVar224 * fVar159;
      auVar230._4_4_ = fVar231 * fVar160;
      auVar230._8_4_ = fVar232 * fVar169;
      auVar230._12_4_ = fVar233 * fVar170;
      auVar81._0_8_ = CONCAT44(fVar89 * fVar240,fVar88 * fVar239);
      auVar81._8_4_ = fVar109 * fVar142;
      auVar81._12_4_ = fVar119 * fVar143;
      auVar167._0_4_ = fVar159 * fVar239;
      auVar167._4_4_ = fVar160 * fVar240;
      auVar167._8_4_ = fVar169 * fVar142;
      auVar167._12_4_ = fVar170 * fVar143;
      auVar95 = maxps(auVar237,auVar206);
      fVar88 = 1.0 - (auVar95._0_4_ + auVar59._0_4_);
      fVar89 = 0.0 - (auVar95._4_4_ + auVar59._4_4_);
      fVar109 = 0.0 - (auVar95._8_4_ + auVar59._8_4_);
      fVar119 = 0.0 - (auVar95._12_4_ + auVar59._12_4_);
      fVar110 = 1.0 - (auVar112._0_4_ + auVar214._0_4_);
      fVar158 = 0.0 - (auVar112._4_4_ + auVar214._4_4_);
      fVar159 = 0.0 - (auVar112._8_4_ + auVar214._8_4_);
      fVar121 = 0.0 - (auVar112._12_4_ + auVar214._12_4_);
      auVar207._0_8_ = CONCAT44(fVar231 * fVar89,fVar224 * fVar88);
      auVar207._8_4_ = fVar232 * fVar109;
      auVar207._12_4_ = fVar233 * fVar119;
      auVar250._0_4_ = fVar224 * fVar110;
      auVar250._4_4_ = fVar231 * fVar158;
      auVar250._8_4_ = fVar232 * fVar159;
      auVar250._12_4_ = fVar233 * fVar121;
      auVar156._0_8_ = CONCAT44(fVar89 * fVar240,fVar88 * fVar239);
      auVar156._8_4_ = fVar109 * fVar142;
      auVar156._12_4_ = fVar119 * fVar143;
      auVar221._0_4_ = fVar110 * fVar239;
      auVar221._4_4_ = fVar158 * fVar240;
      auVar221._8_4_ = fVar159 * fVar142;
      auVar221._12_4_ = fVar121 * fVar143;
      auVar238._8_4_ = auVar207._8_4_;
      auVar238._0_8_ = auVar207._0_8_;
      auVar238._12_4_ = auVar207._12_4_;
      auVar59 = minps(auVar238,auVar250);
      auVar260._8_4_ = auVar156._8_4_;
      auVar260._0_8_ = auVar156._0_8_;
      auVar260._12_4_ = auVar156._12_4_;
      auVar214 = minps(auVar260,auVar221);
      auVar216 = minps(auVar59,auVar214);
      auVar214 = maxps(auVar250,auVar207);
      auVar59 = maxps(auVar221,auVar156);
      auVar95 = maxps(auVar59,auVar214);
      auVar208._8_4_ = auVar105._8_4_;
      auVar208._0_8_ = auVar105._0_8_;
      auVar208._12_4_ = auVar105._12_4_;
      auVar214 = minps(auVar208,auVar230);
      auVar157._8_4_ = auVar81._8_4_;
      auVar157._0_8_ = auVar81._0_8_;
      auVar157._12_4_ = auVar81._12_4_;
      auVar59 = minps(auVar157,auVar167);
      auVar214 = minps(auVar214,auVar59);
      auVar112 = maxps(auVar230,auVar105);
      auVar59 = maxps(auVar167,auVar81);
      auVar59 = maxps(auVar59,auVar112);
      auVar209._0_4_ = auVar216._4_4_ + auVar216._0_4_ + local_1dc;
      auVar209._4_4_ = auVar214._4_4_ + auVar214._0_4_ + fStack_1d8;
      auVar209._8_4_ = auVar216._8_4_ + auVar216._4_4_ + fVar120;
      auVar209._12_4_ = auVar216._12_4_ + auVar214._4_4_ + fVar129;
      fVar88 = auVar95._4_4_ + auVar95._0_4_ + local_1dc;
      fVar89 = auVar59._4_4_ + auVar59._0_4_ + fStack_1d8;
      auVar82._4_4_ = fVar89;
      auVar82._0_4_ = fVar88;
      auVar214 = maxps(_local_418,auVar209);
      auVar82._8_4_ = auVar95._8_4_ + auVar95._4_4_ + fVar120;
      auVar82._12_4_ = auVar95._12_4_ + auVar59._4_4_ + fVar129;
      auVar59 = minps(auVar82,auVar194);
      iVar45 = -(uint)(auVar59._0_4_ < auVar214._0_4_);
      iVar47 = -(uint)(auVar59._4_4_ < auVar214._4_4_);
      auVar84._4_4_ = iVar47;
      auVar84._0_4_ = iVar45;
      auVar84._8_4_ = iVar47;
      auVar84._12_4_ = iVar47;
      auVar83._8_8_ = auVar84._8_8_;
      auVar83._4_4_ = iVar45;
      auVar83._0_4_ = iVar45;
      uVar44 = movmskpd((uint)(fVar107 < 0.0),auVar83);
      if (uVar44 == 0) {
        uVar39 = 0;
        if ((local_3d8 < auVar209._0_4_) && (fVar88 < fStack_3d4)) {
          iVar45 = -(uint)(fVar89 < fVar51);
          uVar39 = (ulong)CONCAT11((char)((uint)iVar45 >> 8),(byte)iVar45 & fVar108 < auVar209._4_4_
                                  );
        }
        if ((byte)((3 < (uint)uVar41 || fVar87 < 0.001) | (byte)uVar39) != 1) goto LAB_00a52e6e;
        uVar39 = 200;
        do {
          fVar51 = 1.0 - local_1dc;
          fVar89 = local_1dc * local_1dc * local_1dc;
          fVar88 = local_1dc * local_1dc * 3.0 * fVar51;
          fVar108 = fVar51 * fVar51 * fVar51;
          fVar107 = local_1dc * 3.0 * fVar51 * fVar51;
          fVar51 = fVar108 * local_298 +
                   fVar107 * (float)local_208._0_4_ +
                   fVar88 * (float)local_2a8 + fVar89 * (float)local_3c8._0_4_;
          fVar87 = fVar108 * fStack_294 +
                   fVar107 * (float)local_208._4_4_ +
                   fVar88 * local_2a8._4_4_ + fVar89 * (float)local_3c8._4_4_;
          fVar51 = ((fVar108 * fStack_290 +
                    fVar107 * fStack_200 + fVar88 * fStack_2a0 + fVar89 * fStack_3c0) - fVar51) *
                   fStack_1d8 + fVar51;
          fVar87 = ((fVar108 * fStack_28c +
                    fVar107 * fStack_1fc + fVar88 * fStack_29c + fVar89 * fStack_3bc) - fVar87) *
                   fStack_1d8 + fVar87;
          local_1dc = local_1dc - (fVar87 * fVar122 + fVar51 * fVar128);
          fStack_1d8 = fStack_1d8 - (fVar87 * fVar127 + fVar51 * fVar144);
          fVar108 = ABS(fVar87);
          if (ABS(fVar87) <= ABS(fVar51)) {
            fVar108 = ABS(fVar51);
          }
          if (fVar108 < local_88) {
            if ((((0.0 <= local_1dc) && (local_1dc <= 1.0)) && (0.0 <= fStack_1d8)) &&
               (fStack_1d8 <= 1.0)) {
              fVar108 = (pre->ray_space).vx.field_0.m128[2];
              fVar51 = (pre->ray_space).vy.field_0.m128[2];
              fVar87 = (pre->ray_space).vz.field_0.m128[2];
              fVar88 = (ray->org).field_0.m128[0];
              fVar89 = (ray->org).field_0.m128[1];
              fVar107 = (ray->org).field_0.m128[2];
              fVar128 = 1.0 - fStack_1d8;
              fVar127 = 1.0 - local_1dc;
              fVar109 = fVar127 * fVar127 * fVar127;
              fVar119 = local_1dc * 3.0 * fVar127 * fVar127;
              fVar122 = local_1dc * local_1dc * local_1dc;
              fVar120 = local_1dc * local_1dc * 3.0 * fVar127;
              fVar108 = (((fStack_340 - fVar107) * fVar87 +
                         (fStack_344 - fVar89) * fVar51 + (local_348 - fVar88) * fVar108) * fVar128
                        + ((fStack_330 - fVar107) * fVar87 +
                          (fStack_334 - fVar89) * fVar51 + (local_338 - fVar88) * fVar108) *
                          fStack_1d8) * fVar109 +
                        (((fStack_350 - fVar107) * fVar87 +
                         (fStack_354 - fVar89) * fVar51 + (local_358 - fVar88) * fVar108) * fVar128
                        + ((fStack_320 - fVar107) * fVar87 +
                          (fStack_324 - fVar89) * fVar51 + (local_328 - fVar88) * fVar108) *
                          fStack_1d8) * fVar119 +
                        (((fStack_370 - fVar107) * fVar87 +
                         (fStack_374 - fVar89) * fVar51 + (local_378 - fVar88) * fVar108) * fVar128
                        + ((fStack_3a0 - fVar107) * fVar87 +
                          (fStack_3a4 - fVar89) * fVar51 + (local_3a8 - fVar88) * fVar108) *
                          fStack_1d8) * fVar120 +
                        (fVar128 * ((fStack_360 - fVar107) * fVar87 +
                                   (fStack_364 - fVar89) * fVar51 + (local_368 - fVar88) * fVar108)
                        + ((fStack_390 - fVar107) * fVar87 +
                          (fStack_394 - fVar89) * fVar51 + (local_398 - fVar88) * fVar108) *
                          fStack_1d8) * fVar122;
              if (((ray->org).field_0.m128[3] <= fVar108) && (fVar51 = ray->tfar, fVar108 <= fVar51)
                 ) {
                fVar107 = 1.0 - fStack_1d8;
                fVar128 = 1.0 - fStack_1d8;
                fVar129 = 1.0 - fStack_1d8;
                fVar87 = local_358 * fVar107 + local_328 * fStack_1d8;
                fVar88 = fStack_354 * fVar128 + fStack_324 * fStack_1d8;
                fVar89 = fStack_350 * fVar129 + fStack_320 * fStack_1d8;
                fVar142 = local_378 * fVar107 + local_3a8 * fStack_1d8;
                fVar144 = fStack_374 * fVar128 + fStack_3a4 * fStack_1d8;
                fVar158 = fStack_370 * fVar129 + fStack_3a0 * fStack_1d8;
                fVar143 = fVar142 - fVar87;
                fVar110 = fVar144 - fVar88;
                fVar159 = fVar158 - fVar89;
                fVar87 = (((fVar87 - (local_348 * fVar107 + local_338 * fStack_1d8)) * fVar127 +
                          local_1dc * fVar143) * fVar127 +
                         (fVar143 * fVar127 +
                         ((fVar107 * local_368 + fStack_1d8 * local_398) - fVar142) * local_1dc) *
                         local_1dc) * 3.0;
                fVar88 = (((fVar88 - (fStack_344 * fVar128 + fStack_334 * fStack_1d8)) * fVar127 +
                          local_1dc * fVar110) * fVar127 +
                         (fVar110 * fVar127 +
                         ((fVar128 * fStack_364 + fStack_1d8 * fStack_394) - fVar144) * local_1dc) *
                         local_1dc) * 3.0;
                fVar89 = (((fVar89 - (fStack_340 * fVar129 + fStack_330 * fStack_1d8)) * fVar127 +
                          local_1dc * fVar159) * fVar127 +
                         (fVar159 * fVar127 +
                         ((fVar129 * fStack_360 + fStack_1d8 * fStack_390) - fVar158) * local_1dc) *
                         local_1dc) * 3.0;
                pGVar5 = (context->scene->geometries).items[local_3b0].ptr;
                if ((pGVar5->mask & ray->mask) == 0) {
LAB_00a5454a:
                  uVar39 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (uVar39 = CONCAT71((int7)(local_3b0 >> 8),1),
                        pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar107 = fVar109 * local_188 +
                            fVar119 * local_198 + fVar120 * local_1a8 + fVar122 * local_1b8;
                  fVar127 = fVar109 * fStack_184 +
                            fVar119 * fStack_194 + fVar120 * fStack_1a4 + fVar122 * fStack_1b4;
                  fVar109 = fVar109 * fStack_180 +
                            fVar119 * fStack_190 + fVar120 * fStack_1a0 + fVar122 * fStack_1b0;
                  local_1e8 = CONCAT44(fVar107 * fVar89 - fVar87 * fVar109,
                                       fVar109 * fVar88 - fVar89 * fVar127);
                  local_1e0 = fVar127 * fVar87 - fVar88 * fVar107;
                  local_1d4 = (int)local_280;
                  local_1d0 = (int)local_3b0;
                  local_1cc = context->user->instID[0];
                  local_1c8 = context->user->instPrimID[0];
                  ray->tfar = fVar108;
                  local_3ec = -1;
                  local_278.valid = &local_3ec;
                  local_278.geometryUserPtr = pGVar5->userPtr;
                  local_278.context = context->user;
                  local_278.ray = (RTCRayN *)ray;
                  local_278.hit = (RTCHitN *)&local_1e8;
                  local_278.N = 1;
                  if ((pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar5->occlusionFilterN)(&local_278), *local_278.valid != 0)) {
                    pRVar40 = context->args;
                    if ((pRVar40->filter == (RTCFilterFunctionN)0x0) ||
                       ((((pRVar40->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (((pGVar5->field_8).field_0x2 & 0x40) == 0)) ||
                        ((*pRVar40->filter)(&local_278), *local_278.valid != 0)))) {
                      uVar39 = CONCAT71((int7)((ulong)pRVar40 >> 8),1);
                      goto LAB_00a5454c;
                    }
                  }
                  ray->tfar = fVar51;
                  goto LAB_00a5454a;
                }
LAB_00a5454c:
                bVar36 = (bool)(bVar36 | (byte)uVar39);
              }
            }
            break;
          }
          uVar39 = uVar39 - 1;
        } while (uVar39 != 0);
      }
      else {
LAB_00a534e4:
        uVar39 = (ulong)uVar44;
      }
    }
  }
  goto LAB_00a534f5;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }